

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O2

REF_STATUS ref_import_by_extension(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_NODE pRVar1;
  REF_GEOM ref_geom;
  REF_CELL pRVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  REF_CELL_TYPE RVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  REF_STATUS RVar11;
  uint uVar12;
  size_t sVar13;
  REF_DBL RVar14;
  REF_FILEPOS *pRVar15;
  char *pcVar16;
  REF_DBL *pRVar17;
  ulong uVar18;
  FILE *pFVar19;
  void *__ptr;
  ulong uVar20;
  REF_GRID_conflict pRVar21;
  REF_GRID_conflict pRVar22;
  REF_SIZE RVar23;
  REF_BYTE *__ptr_00;
  long lVar24;
  long lVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  void *pvVar28;
  REF_INT *value;
  size_t sVar29;
  REF_GRID_conflict pRVar30;
  int *piVar31;
  long lVar32;
  char *pcVar33;
  char *__s1;
  ulong global;
  bool bVar34;
  REF_INT RVar35;
  REF_INT RVar36;
  REF_INT RVar37;
  ulong uStackY_ac0;
  long local_a90;
  REF_INT n2;
  REF_INT nquad;
  REF_INT new_cell;
  REF_INT new_cell_1;
  REF_INT n3;
  REF_INT ntri;
  REF_INT n1;
  REF_GRID_conflict local_a68;
  REF_INT nid;
  REF_INT n0;
  REF_INT nnode;
  undefined4 uStack_a54;
  REF_INT new_node;
  undefined4 uStack_a4c;
  REF_GRID_conflict local_a48;
  REF_INT id;
  REF_GRID_conflict local_a38;
  REF_GRID_conflict *local_a30;
  int local_a28;
  int datasize;
  int filetype;
  REF_INT ngeom;
  REF_DBL y;
  REF_DBL local_a10;
  REF_DBL local_a08 [2];
  REF_GRID_conflict local_9f8;
  int n;
  ulong local_9e8;
  REF_GRID_conflict local_9e0;
  REF_GRID_conflict local_9d8;
  REF_GRID_conflict local_9d0;
  int parameric;
  REF_INT new_cell_3;
  REF_GRID_conflict local_9c0;
  REF_INT type;
  REF_GRID_conflict local_9b0;
  int entity_tag;
  int entity_dim;
  REF_INT nelem;
  REF_DBL x;
  uint local_990;
  REF_INT RStack_98c;
  REF_DBL local_988 [12];
  REF_GRID_conflict local_928;
  REF_GRID_conflict local_920;
  REF_GRID_conflict local_918;
  int node_tag;
  REF_INT nodes [27];
  REF_FILEPOS key_pos [156];
  
  sVar13 = strlen(filename);
  iVar4 = strcmp(filename + (sVar13 - 10),".lb8.ugrid");
  if (iVar4 == 0) {
    uVar8 = ref_import_bin_ugrid(ref_grid_ptr,ref_mpi,filename,0,0);
    if (uVar8 != 0) {
      uStackY_ac0 = (ulong)uVar8;
      pcVar33 = "lb8_ugrid failed";
      uVar26 = 0x6ad;
      goto LAB_00161a8a;
    }
    goto LAB_00161a5b;
  }
  iVar4 = strcmp(filename + (sVar13 - 9),".b8.ugrid");
  if (iVar4 == 0) {
    uVar8 = ref_import_bin_ugrid(ref_grid_ptr,ref_mpi,filename,1,0);
    if (uVar8 != 0) {
      uStackY_ac0 = (ulong)uVar8;
      pcVar33 = "b8_ugrid failed";
      uVar26 = 0x6b1;
      goto LAB_00161a8a;
    }
    goto LAB_00161a5b;
  }
  local_a30 = ref_grid_ptr;
  iVar4 = strcmp(filename + (sVar13 - 0xb),".lb8l.ugrid");
  ref_grid_ptr = local_a30;
  if (iVar4 == 0) {
    uVar8 = ref_import_bin_ugrid(local_a30,ref_mpi,filename,0,1);
    if (uVar8 != 0) {
      uStackY_ac0 = (ulong)uVar8;
      pcVar33 = "lb8_ugrid failed";
      uVar26 = 0x6b5;
      goto LAB_00161a8a;
    }
    goto LAB_00161a5b;
  }
  iVar4 = strcmp(filename + (sVar13 - 10),".b8l.ugrid");
  ref_grid_ptr = local_a30;
  if (iVar4 == 0) {
    uVar8 = ref_import_bin_ugrid(local_a30,ref_mpi,filename,1,1);
    if (uVar8 != 0) {
      uStackY_ac0 = (ulong)uVar8;
      pcVar33 = "b8_ugrid failed";
      uVar26 = 0x6b9;
      goto LAB_00161a8a;
    }
    goto LAB_00161a5b;
  }
  iVar4 = strcmp(filename + (sVar13 - 0xc),".lb8.ugrid64");
  ref_grid_ptr = local_a30;
  if (iVar4 == 0) {
    uVar8 = ref_import_bin_ugrid(local_a30,ref_mpi,filename,0,1);
    if (uVar8 != 0) {
      uStackY_ac0 = (ulong)uVar8;
      pcVar33 = "lb8_ugrid failed";
      uVar26 = 0x6bd;
      goto LAB_00161a8a;
    }
    goto LAB_00161a5b;
  }
  iVar4 = strcmp(filename + (sVar13 - 0xb),".b8.ugrid64");
  ref_grid_ptr = local_a30;
  if (iVar4 == 0) {
    uVar8 = ref_import_bin_ugrid(local_a30,ref_mpi,filename,1,1);
    if (uVar8 != 0) {
      uStackY_ac0 = (ulong)uVar8;
      pcVar33 = "b8_ugrid failed";
      uVar26 = 0x6c1;
      goto LAB_00161a8a;
    }
    goto LAB_00161a5b;
  }
  iVar4 = strcmp(filename + (sVar13 - 9),".r8.ugrid");
  ref_grid_ptr = local_a30;
  if (iVar4 == 0) {
    uVar8 = ref_grid_create(local_a30,ref_mpi);
    if (uVar8 == 0) {
      pRVar30 = *ref_grid_ptr;
      pRVar1 = pRVar30->node;
      pFVar19 = fopen(filename,"r");
      if (pFVar19 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x28c,"ref_import_r8_ugrid","unable to open file");
        uStackY_ac0 = 2;
        goto LAB_0015bb1c;
      }
      sVar13 = fread(&new_cell_1,4,1,pFVar19);
      if (sVar13 != 1) {
        pcVar33 = "nnode";
        uVar26 = 0x28e;
        goto LAB_0015b877;
      }
      pRVar21 = (REF_GRID_conflict)
                ((ulong)new_cell_1._2_1_ << 8 |
                 (long)(new_cell_1 << 0x18) | (ulong)new_cell_1._1_1_ << 0x10 |
                (ulong)new_cell_1._3_1_);
      new_cell_1 = (REF_INT)pRVar21;
      if (new_cell_1 != 0x1c) {
        pcVar33 = "header start record size";
        uStackY_ac0 = 0x1c;
        uVar26 = 0x290;
        goto LAB_0015bb12;
      }
      sVar13 = fread(&x,4,1,pFVar19);
      if (sVar13 != 1) {
        pcVar33 = "nnode";
        uVar26 = 0x292;
        goto LAB_0015b877;
      }
      sVar13 = fread(&y,4,1,pFVar19);
      if (sVar13 != 1) {
        pcVar33 = "ntri";
        uVar26 = 0x293;
        goto LAB_0015b877;
      }
      sVar13 = fread(&new_node,4,1,pFVar19);
      if (sVar13 != 1) {
        pcVar33 = "nqua";
        uVar26 = 0x294;
        goto LAB_0015b877;
      }
      sVar13 = fread(&nnode,4,1,pFVar19);
      if (sVar13 != 1) {
        pcVar33 = "ntet";
        uVar26 = 0x295;
        goto LAB_0015b877;
      }
      sVar13 = fread(&ntri,4,1,pFVar19);
      if (sVar13 != 1) {
        pcVar33 = "npyr";
        uVar26 = 0x296;
        goto LAB_0015b877;
      }
      sVar13 = fread(&nquad,4,1,pFVar19);
      if (sVar13 != 1) {
        pcVar33 = "npri";
        uVar26 = 0x297;
        goto LAB_0015b877;
      }
      sVar13 = fread(&new_cell,4,1,pFVar19);
      if (sVar13 != 1) {
        pcVar33 = "nhex";
        uVar26 = 0x298;
        goto LAB_0015b877;
      }
      sVar13 = fread(&new_cell_1,4,1,pFVar19);
      if (sVar13 != 1) {
        pcVar33 = "nnode";
        uVar26 = 0x29a;
        goto LAB_0015b877;
      }
      pRVar21 = (REF_GRID_conflict)
                ((ulong)new_cell_1._2_1_ << 8 |
                 (long)(new_cell_1 << 0x18) | (ulong)new_cell_1._1_1_ << 0x10 |
                (ulong)new_cell_1._3_1_);
      new_cell_1 = (REF_INT)pRVar21;
      if (new_cell_1 == 0x1c) {
        uVar20 = (ulong)x._2_1_ << 8 | (long)(int)((uint)x._0_1_ << 0x18) | (ulong)x._1_1_ << 0x10 |
                 (ulong)x._3_1_;
        y._0_4_ = y._0_4_ >> 0x18 | (y._0_4_ & 0xff0000) >> 8 | (y._0_4_ & 0xff00) << 8 |
                  y._0_4_ << 0x18;
        local_a68 = (REF_GRID_conflict)(ulong)y._0_4_;
        new_node = (uint)new_node >> 0x18 | (new_node & 0xff0000U) >> 8 | (new_node & 0xff00U) << 8
                   | new_node << 0x18;
        local_a48 = (REF_GRID_conflict)(ulong)(uint)new_node;
        nnode = (uint)nnode >> 0x18 | (nnode & 0xff0000U) >> 8 | (nnode & 0xff00U) << 8 |
                nnode << 0x18;
        local_a38 = (REF_GRID_conflict)(ulong)(uint)nnode;
        ntri = (uint)ntri >> 0x18 | (ntri & 0xff0000U) >> 8 | (ntri & 0xff00U) << 8 | ntri << 0x18;
        local_9f8 = (REF_GRID_conflict)(ulong)(uint)ntri;
        nquad = (uint)nquad >> 0x18 | (nquad & 0xff0000U) >> 8 | (nquad & 0xff00U) << 8 |
                nquad << 0x18;
        local_9d8 = (REF_GRID_conflict)(ulong)(uint)nquad;
        new_cell = (uint)new_cell >> 0x18 | (new_cell & 0xff0000U) >> 8 | (new_cell & 0xff00U) << 8
                   | new_cell << 0x18;
        local_9e0 = (REF_GRID_conflict)CONCAT44(local_9e0._4_4_,new_cell);
        sVar13 = fread(&new_cell_1,4,1,pFVar19);
        if (sVar13 == 1) {
          pRVar21 = (REF_GRID_conflict)
                    ((ulong)new_cell_1._2_1_ << 8 |
                     (long)(new_cell_1 << 0x18) | (ulong)new_cell_1._1_1_ << 0x10 |
                    (ulong)new_cell_1._3_1_);
          new_cell_1 = (REF_INT)pRVar21;
          iVar4 = ((int)local_9d8 + (int)uVar20) * 0x18 +
                  ((int)local_a38 + (int)local_a68) * 0x10 +
                  ((int)local_9f8 + (int)local_a48) * 0x14 + (int)local_9e0 * 0x20;
          local_9c0 = pRVar21;
          if (iVar4 != new_cell_1) {
            uStackY_ac0 = (ulong)iVar4;
            pcVar33 = "block start record size";
            uVar26 = 0x2aa;
            goto LAB_0015bb12;
          }
          global = 0;
          uVar18 = 0;
          if (0 < (long)uVar20) {
            uVar18 = uVar20;
          }
          for (; uVar18 != global; global = global + 1) {
            uVar8 = ref_node_add(pRVar1,global,&nid);
            if (uVar8 != 0) {
              uStackY_ac0 = (ulong)uVar8;
              pcVar33 = "new_node";
              uVar26 = 0x2ad;
              goto LAB_0015b057;
            }
            if (global != (uint)nid) {
              pcVar33 = "node index";
              uVar26 = 0x2ae;
              goto LAB_0015b877;
            }
            sVar13 = fread(nodes,8,1,pFVar19);
            if (sVar13 != 1) {
              pcVar33 = "x";
              uVar26 = 0x2af;
              goto LAB_0015b877;
            }
            uVar3 = (ulong)((uint)nodes[1] >> 0x18) |
                    (((ulong)(uint)nodes[1] & 0xff0000) << 0x20) >> 0x28 |
                    (((ulong)(uint)nodes[1] & 0xff00) << 0x20) >> 0x18 |
                    (((ulong)(uint)nodes[1] & 0xff) << 0x20) >> 8;
            RVar14 = (REF_DBL)(uVar3 | ((ulong)(uint)nodes[0] & 0xff000000) << 8 |
                               ((ulong)(uint)nodes[0] & 0xff0000) << 0x18 |
                               ((ulong)(uint)nodes[0] & 0xff00) << 0x28 |
                              CONCAT44(nodes[1],nodes[0]) << 0x38);
            nodes[0] = (REF_INT)uVar3;
            nodes[1] = (REF_INT)((ulong)RVar14 >> 0x20);
            pRVar1->real[(long)nid * 0xf] = RVar14;
            sVar13 = fread(nodes,8,1,pFVar19);
            if (sVar13 != 1) {
              pcVar33 = "y";
              uVar26 = 0x2b2;
              goto LAB_0015b877;
            }
            uVar3 = (ulong)((uint)nodes[1] >> 0x18) |
                    (((ulong)(uint)nodes[1] & 0xff0000) << 0x20) >> 0x28 |
                    (((ulong)(uint)nodes[1] & 0xff00) << 0x20) >> 0x18 |
                    (((ulong)(uint)nodes[1] & 0xff) << 0x20) >> 8;
            RVar14 = (REF_DBL)(uVar3 | ((ulong)(uint)nodes[0] & 0xff000000) << 8 |
                               ((ulong)(uint)nodes[0] & 0xff0000) << 0x18 |
                               ((ulong)(uint)nodes[0] & 0xff00) << 0x28 |
                              CONCAT44(nodes[1],nodes[0]) << 0x38);
            nodes[0] = (REF_INT)uVar3;
            nodes[1] = (REF_INT)((ulong)RVar14 >> 0x20);
            pRVar1->real[(long)nid * 0xf + 1] = RVar14;
            sVar13 = fread(nodes,8,1,pFVar19);
            if (sVar13 != 1) {
              pcVar33 = "z";
              uVar26 = 0x2b5;
              goto LAB_0015b877;
            }
            uVar3 = (ulong)((uint)nodes[1] >> 0x18) |
                    (((ulong)(uint)nodes[1] & 0xff0000) << 0x20) >> 0x28 |
                    (((ulong)(uint)nodes[1] & 0xff00) << 0x20) >> 0x18 |
                    (((ulong)(uint)nodes[1] & 0xff) << 0x20) >> 8;
            RVar14 = (REF_DBL)(uVar3 | ((ulong)(uint)nodes[0] & 0xff000000) << 8 |
                               ((ulong)(uint)nodes[0] & 0xff0000) << 0x18 |
                               ((ulong)(uint)nodes[0] & 0xff00) << 0x28 |
                              CONCAT44(nodes[1],nodes[0]) << 0x38);
            nodes[0] = (REF_INT)uVar3;
            nodes[1] = (REF_INT)((ulong)RVar14 >> 0x20);
            pRVar1->real[(long)nid * 0xf + 2] = RVar14;
          }
          uVar8 = ref_node_initialize_n_global(pRVar1,uVar20);
          if (uVar8 != 0) {
            uStackY_ac0 = (ulong)uVar8;
            pcVar33 = "init glob";
            uVar26 = 0x2ba;
            goto LAB_0015b057;
          }
          local_9d0 = (REF_GRID_conflict)pRVar30->cell[3];
          key_pos[1]._4_4_ = -1;
          iVar4 = (int)local_a68;
          local_a68 = (REF_GRID_conflict)((ulong)local_a68 & 0xffffffff);
          if (iVar4 < 1) {
            local_a68 = (REF_GRID_conflict)0x0;
          }
          iVar4 = 0;
          do {
            if (iVar4 == (int)local_a68) {
              local_9d0 = (REF_GRID_conflict)pRVar30->cell[6];
              key_pos[2] = CONCAT44(key_pos[2]._4_4_,0xffffffff);
              iVar4 = (int)local_a48;
              local_a48 = (REF_GRID_conflict)((ulong)local_a48 & 0xffffffff);
              if (iVar4 < 1) {
                local_a48 = (REF_GRID_conflict)0x0;
              }
              iVar4 = 0;
              goto LAB_001607d9;
            }
            uVar8 = *(REF_INT *)((long)&local_9d0->node + 4);
            if ((int)uVar8 < 1) {
              uVar8 = 0;
            }
            for (lVar32 = 0; (ulong)uVar8 * 4 != lVar32; lVar32 = lVar32 + 4) {
              sVar13 = fread((void *)((long)key_pos + lVar32),4,1,pFVar19);
              if (sVar13 != 1) {
                pcVar33 = "tri";
                uVar26 = 0x2c1;
                goto LAB_0015b877;
              }
              uVar12 = *(uint *)((long)key_pos + lVar32);
              *(uint *)((long)key_pos + lVar32) =
                   (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                   uVar12 << 0x18) - 1;
            }
            uVar8 = ref_cell_add((REF_CELL)local_9d0,(REF_INT *)key_pos,&n0);
            if (uVar8 != 0) {
              uStackY_ac0 = (ulong)uVar8;
              pcVar33 = "new tri";
              uVar26 = 0x2c5;
              goto LAB_0015b057;
            }
            bVar34 = iVar4 == n0;
            iVar4 = iVar4 + 1;
          } while (bVar34);
          pcVar33 = "tri index";
          uVar26 = 0x2c6;
        }
        else {
          pcVar33 = "nnode";
          uVar26 = 0x2a6;
        }
        goto LAB_0015b877;
      }
      pcVar33 = "header end record size";
      uStackY_ac0 = 0x1c;
      uVar26 = 0x29c;
LAB_0015bb12:
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             uVar26,"ref_import_r8_ugrid",pcVar33,uStackY_ac0,pRVar21);
      goto LAB_0015bb19;
    }
    uStackY_ac0 = (ulong)uVar8;
    pcVar33 = "create grid";
    uVar26 = 0x286;
LAB_0015b057:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar26
           ,"ref_import_r8_ugrid",uStackY_ac0,pcVar33);
    goto LAB_0015bb1c;
  }
  pcVar33 = filename + (sVar13 - 6);
  iVar4 = strcmp(pcVar33,".ugrid");
  if (iVar4 != 0) {
    pcVar16 = filename + (sVar13 - 4);
    iVar4 = strcmp(pcVar16,".tri");
    if (iVar4 == 0) {
      uVar8 = ref_grid_create(ref_grid_ptr,ref_mpi);
      if (uVar8 == 0) {
        pRVar30 = *ref_grid_ptr;
        pRVar1 = pRVar30->node;
        pFVar19 = fopen(filename,"r");
        if (pFVar19 != (FILE *)0x0) {
          iVar4 = __isoc99_fscanf(pFVar19,"%d %d",&x);
          if (iVar4 == 2) {
            uVar20 = 0xffffffffffffffff;
            do {
              uVar20 = uVar20 + 1;
              lVar32 = (long)CONCAT13(x._3_1_,CONCAT12(x._2_1_,CONCAT11(x._1_1_,x._0_1_)));
              if (lVar32 <= (long)uVar20) {
                uVar8 = ref_node_initialize_n_global(pRVar1,lVar32);
                if (uVar8 == 0) {
                  lVar25 = 0;
                  lVar32 = 0;
                  goto LAB_0015d535;
                }
                uVar20 = (ulong)uVar8;
                pcVar33 = "init glob";
                uStackY_ac0 = 0x78;
                goto LAB_0015b0e3;
              }
              uVar8 = ref_node_add(pRVar1,uVar20,&new_node);
              if (uVar8 != 0) {
                uVar20 = (ulong)uVar8;
                pcVar33 = "new_node";
                uStackY_ac0 = 0x74;
                goto LAB_0015b0e3;
              }
            } while (uVar20 == (uint)new_node);
            pcVar33 = "node index";
            uStackY_ac0 = 0x75;
          }
          else {
            pcVar33 = "nnode ntri";
            uStackY_ac0 = 0x71;
          }
          goto LAB_0015bc82;
        }
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x6f,"ref_import_tri","unable to open file");
        uStackY_ac0 = 2;
      }
      else {
        uVar20 = (ulong)uVar8;
        pcVar33 = "create grid";
        uStackY_ac0 = 0x69;
LAB_0015b0e3:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               uStackY_ac0,"ref_import_tri",uVar20,pcVar33);
        uStackY_ac0 = uVar20;
      }
      goto LAB_0015bc8c;
    }
    __s1 = filename + (sVar13 - 5);
    iVar4 = strcmp(__s1,".surf");
    if (iVar4 == 0) {
      uVar8 = ref_grid_create(ref_grid_ptr,ref_mpi);
      if (uVar8 == 0) {
        pRVar30 = *ref_grid_ptr;
        pRVar1 = pRVar30->node;
        pFVar19 = fopen(filename,"r");
        if (pFVar19 == (FILE *)0x0) {
          printf("unable to open %s\n",filename);
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x192,"ref_import_surf","unable to open file");
          uStackY_ac0 = 2;
        }
        else {
          iVar4 = __isoc99_fscanf(pFVar19,"%d",&new_node);
          if (iVar4 == 1) {
            iVar4 = __isoc99_fscanf(pFVar19,"%d",&nnode);
            if (iVar4 == 1) {
              iVar4 = __isoc99_fscanf(pFVar19,"%d",&y);
              if (iVar4 == 1) {
                for (uVar20 = 0; (long)uVar20 < (long)(int)y._0_4_; uVar20 = uVar20 + 1) {
                  uVar8 = ref_node_add(pRVar1,uVar20,&ntri);
                  if (uVar8 != 0) {
                    uStackY_ac0 = (ulong)uVar8;
                    pcVar33 = "new_node";
                    uVar26 = 0x199;
                    goto LAB_0015b51f;
                  }
                  if (uVar20 != (uint)ntri) {
                    pcVar33 = "node index";
                    uVar26 = 0x19a;
                    goto LAB_0015d4f8;
                  }
                  iVar4 = __isoc99_fscanf(pFVar19,"%lf",&x);
                  if (iVar4 != 1) {
                    pcVar33 = "x";
                    uVar26 = 0x19b;
                    goto LAB_0015d4f8;
                  }
                  iVar4 = __isoc99_fscanf(pFVar19,"%lf",&local_990);
                  if (iVar4 != 1) {
                    pcVar33 = "y";
                    uVar26 = 0x19c;
                    goto LAB_0015d4f8;
                  }
                  iVar4 = __isoc99_fscanf(pFVar19,"%lf",local_988);
                  if (iVar4 != 1) {
                    pcVar33 = "z";
                    uVar26 = 0x19d;
                    goto LAB_0015d4f8;
                  }
                  pRVar17 = pRVar1->real;
                  lVar32 = (long)ntri;
                  pRVar17[lVar32 * 0xf] =
                       (REF_DBL)CONCAT44(x._4_4_,CONCAT13(x._3_1_,CONCAT12(x._2_1_,CONCAT11(x._1_1_,
                                                  x._0_1_))));
                  pRVar17[lVar32 * 0xf + 1] = (REF_DBL)CONCAT44(RStack_98c,local_990);
                  pRVar17[lVar32 * 0xf + 2] = local_988[0];
                  fgets((char *)key_pos,0x400,pFVar19);
                }
                uVar8 = ref_node_initialize_n_global(pRVar1,(long)(int)y._0_4_);
                if (uVar8 != 0) {
                  uStackY_ac0 = (ulong)uVar8;
                  pcVar33 = "init glob";
                  uVar26 = 0x1a4;
                  goto LAB_0015b51f;
                }
                pRVar2 = pRVar30->cell[3];
                nodes[3] = -1;
                iVar4 = 0;
                do {
                  if (new_node <= iVar4) {
                    pRVar2 = pRVar30->cell[6];
                    nodes[4] = -1;
                    iVar4 = 0;
                    goto LAB_0015f4bb;
                  }
                  lVar32 = 0;
                  while (lVar32 + 4 != 0x14) {
                    iVar10 = __isoc99_fscanf(pFVar19,"%d",(long)nodes + lVar32);
                    lVar32 = lVar32 + 4;
                    if (iVar10 != 1) {
                      pcVar33 = "tri";
                      uVar26 = 0x1aa;
                      goto LAB_0015d4f8;
                    }
                  }
                  iVar10 = 3;
                  while (iVar10 = iVar10 + -1, iVar10 != 0) {
                    iVar9 = __isoc99_fscanf(pFVar19,"%d",&nid);
                    if (iVar9 != 1) {
                      pcVar33 = "extra 0 1";
                      uVar26 = 0x1ac;
                      goto LAB_0015d4f8;
                    }
                  }
                  nodes[0] = nodes[0] + -1;
                  nodes[1] = nodes[1] + -1;
                  nodes[2] = nodes[2] + -1;
                  uVar8 = ref_cell_add(pRVar2,nodes,&nquad);
                  if (uVar8 != 0) {
                    uStackY_ac0 = (ulong)uVar8;
                    pcVar33 = "new tri";
                    uVar26 = 0x1b0;
                    goto LAB_0015b51f;
                  }
                  bVar34 = iVar4 == nquad;
                  iVar4 = iVar4 + 1;
                } while (bVar34);
                pcVar33 = "tri index";
                uVar26 = 0x1b1;
              }
              else {
                pcVar33 = "nnode";
                uVar26 = 0x196;
              }
            }
            else {
              pcVar33 = "nqua";
              uVar26 = 0x195;
            }
          }
          else {
            pcVar33 = "ntri";
            uVar26 = 0x194;
          }
LAB_0015d4f8:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 uVar26,"ref_import_surf",pcVar33);
          uStackY_ac0 = 1;
        }
      }
      else {
        uStackY_ac0 = (ulong)uVar8;
        pcVar33 = "create grid";
        uVar26 = 0x18c;
LAB_0015b51f:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               uVar26,"ref_import_surf",uStackY_ac0,pcVar33);
      }
      pcVar33 = "surf failed";
      uVar26 = 0x6ca;
      goto LAB_00161a8a;
    }
    iVar4 = strcmp(pcVar33,".fgrid");
    if (iVar4 == 0) {
      uVar8 = ref_grid_create(ref_grid_ptr,ref_mpi);
      if (uVar8 == 0) {
        pRVar30 = *ref_grid_ptr;
        pRVar1 = pRVar30->node;
        pFVar19 = fopen(filename,"r");
        if (pFVar19 != (FILE *)0x0) {
          iVar4 = __isoc99_fscanf(pFVar19,"%d",&x);
          if (iVar4 == 1) {
            iVar4 = __isoc99_fscanf(pFVar19,"%d",&y);
            if (iVar4 == 1) {
              iVar4 = __isoc99_fscanf(pFVar19,"%d",&new_node);
              if (iVar4 == 1) {
                uVar20 = 0xffffffffffffffff;
LAB_0015bbcf:
                uVar20 = uVar20 + 1;
                lVar32 = (long)CONCAT13(x._3_1_,CONCAT12(x._2_1_,CONCAT11(x._1_1_,x._0_1_)));
                if ((long)uVar20 < lVar32) {
                  uVar8 = ref_node_add(pRVar1,uVar20,&nnode);
                  if (uVar8 == 0) goto code_r0x0015bbf9;
                  uStackY_ac0 = (ulong)uVar8;
                  pcVar33 = "new_node";
                  uVar26 = 0xb2;
                }
                else {
                  uVar8 = ref_node_initialize_n_global(pRVar1,lVar32);
                  if (uVar8 == 0) {
                    local_a68 = (REF_GRID_conflict)0x0;
                    for (local_a90 = 0; local_a90 != 3; local_a90 = local_a90 + 1) {
                      pRVar21 = local_a68;
                      for (lVar32 = 0;
                          lVar32 < CONCAT13(x._3_1_,CONCAT12(x._2_1_,CONCAT11(x._1_1_,x._0_1_)));
                          lVar32 = lVar32 + 1) {
                        iVar4 = __isoc99_fscanf(pFVar19,"%lf",nodes);
                        if (iVar4 != 1) {
                          pcVar33 = "xyz";
                          uVar26 = 0xba;
                          goto LAB_0015d7a0;
                        }
                        *(ulong *)((long)pRVar1->real + (long)pRVar21) = CONCAT44(nodes[1],nodes[0])
                        ;
                        pRVar21 = (REF_GRID_conflict)(pRVar21->cell + 0xd);
                      }
                      local_a68 = (REF_GRID_conflict)&local_a68->node;
                    }
                    pRVar2 = pRVar30->cell[3];
                    key_pos[1]._4_4_ = -1;
                    iVar4 = 0;
                    while (iVar4 < (int)y._0_4_) {
                      lVar32 = 0;
                      while (lVar32 + 4 != 0x10) {
                        iVar10 = __isoc99_fscanf(pFVar19,"%d",(long)key_pos + lVar32);
                        lVar32 = lVar32 + 4;
                        if (iVar10 != 1) {
                          pcVar33 = "tri";
                          uVar26 = 0xc2;
                          goto LAB_0015d7a0;
                        }
                      }
                      key_pos[0] = CONCAT44((int)((ulong)key_pos[0] >> 0x20) + -1,
                                            (int)key_pos[0] + -1);
                      key_pos[1]._0_4_ = (int)key_pos[1] + -1;
                      uVar8 = ref_cell_add(pRVar2,(REF_INT *)key_pos,&ntri);
                      if (uVar8 != 0) {
                        uStackY_ac0 = (ulong)uVar8;
                        pcVar33 = "new tri";
                        uVar26 = 0xc6;
                        goto LAB_0015b75d;
                      }
                      bVar34 = iVar4 != ntri;
                      iVar4 = iVar4 + 1;
                      if (bVar34) {
                        pcVar33 = "tri index";
                        uVar26 = 199;
                        goto LAB_0015d7a0;
                      }
                    }
                    pRVar2 = pRVar30->cell[3];
                    for (iVar4 = 0; iVar4 < (int)y._0_4_; iVar4 = iVar4 + 1) {
                      iVar10 = __isoc99_fscanf(pFVar19,"%d",&nquad);
                      if (iVar10 != 1) {
                        pcVar33 = "tri id";
                        uVar26 = 0xcc;
                        goto LAB_0015d7a0;
                      }
                      pRVar2->c2n[(long)iVar4 * (long)pRVar2->size_per + 3] = nquad;
                    }
                    pRVar2 = pRVar30->cell[8];
                    iVar4 = 0;
                    while (iVar4 < new_node) {
                      lVar32 = 0;
                      while (lVar32 + 4 != 0x14) {
                        iVar10 = __isoc99_fscanf(pFVar19,"%d",(long)key_pos + lVar32);
                        lVar32 = lVar32 + 4;
                        if (iVar10 != 1) {
                          pcVar33 = "tet";
                          uVar26 = 0xd3;
                          goto LAB_0015d7a0;
                        }
                      }
                      key_pos[1]._0_4_ = (int)key_pos[1] + -1;
                      key_pos[1]._4_4_ = key_pos[1]._4_4_ + -1;
                      key_pos[0] = CONCAT44(key_pos[0]._4_4_ + -1,(int)key_pos[0] + -1);
                      uVar8 = ref_cell_add(pRVar2,(REF_INT *)key_pos,&new_cell);
                      if (uVar8 != 0) {
                        uStackY_ac0 = (ulong)uVar8;
                        pcVar33 = "new tet";
                        uVar26 = 0xd8;
                        goto LAB_0015b75d;
                      }
                      bVar34 = iVar4 != new_cell;
                      iVar4 = iVar4 + 1;
                      if (bVar34) {
                        pcVar33 = "tet index";
                        uVar26 = 0xd9;
                        goto LAB_0015d7a0;
                      }
                    }
                    goto LAB_00161a4e;
                  }
                  uStackY_ac0 = (ulong)uVar8;
                  pcVar33 = "init glob";
                  uVar26 = 0xb6;
                }
                goto LAB_0015b75d;
              }
              pcVar33 = "ntet";
              uVar26 = 0xaf;
            }
            else {
              pcVar33 = "ntri";
              uVar26 = 0xae;
            }
          }
          else {
            pcVar33 = "nnode";
            uVar26 = 0xad;
          }
          goto LAB_0015d7a0;
        }
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0xab,"ref_import_fgrid","unable to open file");
        uStackY_ac0 = 2;
      }
      else {
        uStackY_ac0 = (ulong)uVar8;
        pcVar33 = "create grid";
        uVar26 = 0xa5;
LAB_0015b75d:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               uVar26,"ref_import_fgrid",uStackY_ac0,pcVar33);
      }
      goto LAB_0015d7aa;
    }
    iVar4 = strcmp(pcVar16,".su2");
    if (iVar4 == 0) {
      uVar8 = ref_grid_create(ref_grid_ptr,ref_mpi);
      if (uVar8 == 0) {
        pRVar30 = *ref_grid_ptr;
        pRVar21 = (REF_GRID_conflict)pRVar30->node;
        pFVar19 = fopen(filename,"r");
        if (pFVar19 != (FILE *)0x0) {
          local_a90._0_4_ = 0xffffffff;
          local_a68 = pRVar30;
LAB_0015bd7a:
          do {
            iVar4 = feof(pFVar19);
            if (iVar4 != 0) goto LAB_00161a4e;
            pRVar15 = (REF_FILEPOS *)fgets((char *)key_pos,0x400,pFVar19);
            ref_grid_ptr = local_a30;
            if (key_pos != pRVar15) goto LAB_00161a5b;
            pcVar33 = strchr((char *)key_pos,0x3d);
            if (pcVar33 != (char *)0x0) {
              local_a48 = pRVar21;
              pcVar16 = strstr((char *)key_pos,"NDIME");
              if (pcVar16 != (char *)0x0) {
                local_a90._0_4_ = atoi(pcVar33 + 1);
                printf("NDIME %d\n",(ulong)(uint)local_a90);
                if ((uint)local_a90 == 2) {
                  pRVar30->twod = 1;
                  local_a90._0_4_ = 2;
                }
              }
              pcVar16 = strstr((char *)key_pos,"NPOIN");
              if (pcVar16 != (char *)0x0) {
                uVar8 = atoi(pcVar33 + 1);
                printf("NPOIN %d\n",(ulong)uVar8);
                pRVar30 = local_a48;
                local_a38 = (REF_GRID_conflict)CONCAT44(local_a38._4_4_,uVar8);
                uVar20 = 0;
                if (0 < (int)uVar8) {
                  uVar20 = (ulong)uVar8;
                }
                for (uVar18 = 0; uVar20 != uVar18; uVar18 = uVar18 + 1) {
                  pRVar15 = (REF_FILEPOS *)fgets((char *)key_pos,0x400,pFVar19);
                  if (key_pos != pRVar15) {
                    pcVar33 = "unable to read point xyz line";
                    uVar26 = 0x345;
                    goto LAB_0015f135;
                  }
                  if ((uint)local_a90 == 2) {
                    iVar4 = __isoc99_sscanf(key_pos,"%lf %lf",&x,&y);
                    if (iVar4 != 2) {
                      lVar32 = (long)iVar4;
                      pcVar33 = "parse xyz";
                      uVar26 = 2;
                      uVar27 = 0x347;
                      goto LAB_0015ede2;
                    }
                    uVar8 = ref_node_add((REF_NODE)pRVar30,uVar18,&nnode);
                    if (uVar8 != 0) {
                      uStackY_ac0 = (ulong)uVar8;
                      pcVar33 = "add node";
                      uVar26 = 0x348;
                      goto LAB_0015b8bb;
                    }
                    pRVar2 = pRVar30->cell[5];
                    lVar32 = (long)nnode * 0x78;
                    pRVar17 = (REF_DBL *)((long)pRVar2 + lVar32);
                    *(ulong *)((long)pRVar2 + lVar32) =
                         CONCAT44(x._4_4_,CONCAT13(x._3_1_,CONCAT12(x._2_1_,CONCAT11(x._1_1_,x._0_1_
                                                                                    ))));
                    *(ulong *)((long)pRVar2 + lVar32 + 8) = CONCAT44(y._4_4_,y._0_4_);
                    RVar14 = 0.0;
                  }
                  else {
                    iVar4 = __isoc99_sscanf(key_pos,"%lf %lf %lf",&x,&y,&new_node);
                    if (iVar4 != 3) {
                      lVar32 = (long)iVar4;
                      pcVar33 = "parse xyz";
                      uVar26 = 3;
                      uVar27 = 0x34d;
                      goto LAB_0015ede2;
                    }
                    uVar8 = ref_node_add((REF_NODE)pRVar30,uVar18,&nnode);
                    if (uVar8 != 0) {
                      uStackY_ac0 = (ulong)uVar8;
                      pcVar33 = "add node";
                      uVar26 = 0x34e;
                      goto LAB_0015b8bb;
                    }
                    pRVar2 = pRVar30->cell[5];
                    lVar32 = (long)nnode * 0x78;
                    pRVar17 = (REF_DBL *)((long)pRVar2 + lVar32);
                    *(ulong *)((long)pRVar2 + lVar32) =
                         CONCAT44(x._4_4_,CONCAT13(x._3_1_,CONCAT12(x._2_1_,CONCAT11(x._1_1_,x._0_1_
                                                                                    ))));
                    *(ulong *)((long)pRVar2 + lVar32 + 8) = CONCAT44(y._4_4_,y._0_4_);
                    RVar14 = (REF_DBL)CONCAT44(uStack_a4c,new_node);
                  }
                  pRVar17[2] = RVar14;
                }
                uVar8 = ref_node_initialize_n_global((REF_NODE)pRVar30,(long)(int)local_a38);
                pRVar30 = local_a68;
                if (uVar8 != 0) {
                  uStackY_ac0 = (ulong)uVar8;
                  pcVar33 = "init glob";
                  uVar26 = 0x354;
                  goto LAB_0015b8bb;
                }
              }
              pcVar16 = strstr((char *)key_pos,"NELEM");
              if (pcVar16 == (char *)0x0) {
LAB_0015c383:
                pcVar16 = strstr((char *)key_pos,"NMARK");
                pRVar21 = local_a48;
                if (pcVar16 == (char *)0x0) goto LAB_0015bd7a;
                uVar8 = atoi(pcVar33 + 1);
                printf("NMARK %d\n",(ulong)uVar8);
                if ((int)uVar8 < 1) {
                  uVar8 = 0;
                }
                uVar12 = 1;
                while( true ) {
                  pRVar30 = local_a68;
                  pRVar21 = local_a48;
                  if (uVar12 == uVar8 + 1) goto LAB_0015bd7a;
                  pRVar15 = (REF_FILEPOS *)fgets((char *)key_pos,0x400,pFVar19);
                  if (key_pos != pRVar15) break;
                  printf("%d: %s",(ulong)uVar12,key_pos);
                  pcVar33 = strstr((char *)key_pos,"MARKER_TAG");
                  if (pcVar33 == (char *)0x0) {
                    pcVar33 = "MARKER_TAG not found";
                    uVar26 = 0x39a;
                    goto LAB_0015f135;
                  }
                  pRVar15 = (REF_FILEPOS *)fgets((char *)key_pos,0x400,pFVar19);
                  if (key_pos != pRVar15) {
                    pcVar33 = "unable to read marker elems";
                    uVar26 = 0x39b;
                    goto LAB_0015f135;
                  }
                  pcVar33 = strstr((char *)key_pos,"MARKER_ELEMS");
                  if (pcVar33 == (char *)0x0) {
                    pcVar33 = "MARKER_ELEMS not found";
                    uVar26 = 0x39c;
                    goto LAB_0015f135;
                  }
                  pcVar33 = strchr((char *)key_pos,0x3d);
                  if (pcVar33 == (char *)0x0) {
                    pcVar33 = "MARKER_ELEMS missing =";
                    uVar26 = 0x39e;
                    goto LAB_0015d376;
                  }
                  uVar5 = atoi(pcVar33 + 1);
                  printf("%d: %s",(ulong)uVar5,key_pos);
                  if ((int)uVar5 < 1) {
                    uVar5 = 0;
                  }
                  while (bVar34 = uVar5 != 0, uVar5 = uVar5 - 1, bVar34) {
                    pRVar15 = (REF_FILEPOS *)fgets((char *)key_pos,0x400,pFVar19);
                    if (key_pos != pRVar15) {
                      pcVar33 = "unable to read marker line";
                      uVar26 = 0x3a2;
                      goto LAB_0015f135;
                    }
                    iVar4 = __isoc99_sscanf(key_pos,"%d",&nquad);
                    if (iVar4 != 1) {
                      lVar32 = (long)iVar4;
                      pcVar33 = "parse marker element type";
                      uVar26 = 1;
                      uVar27 = 0x3a3;
                      goto LAB_0015ede2;
                    }
                    if (nquad == 3) {
                      iVar4 = __isoc99_sscanf(key_pos,"%d %d %d",&nquad,nodes,nodes + 1);
                      if (iVar4 != 3) {
                        lVar32 = (long)iVar4;
                        pcVar33 = "parse marker element";
                        uVar26 = 3;
                        uVar27 = 0x3bb;
                        goto LAB_0015ede2;
                      }
                      nodes[2] = uVar12;
                      uVar6 = ref_cell_add(local_a68->cell[0],nodes,&ntri);
                      if (uVar6 != 0) {
                        uStackY_ac0 = (ulong)uVar6;
                        pcVar33 = "edg";
                        uVar26 = 0x3be;
                        goto LAB_0015b8bb;
                      }
                    }
                    else if (nquad == 9) {
                      iVar4 = __isoc99_sscanf(key_pos,"%d %d %d %d %d",&nquad,nodes,nodes + 1,
                                              nodes + 2,nodes + 3);
                      if (iVar4 != 5) {
                        lVar32 = (long)iVar4;
                        pcVar33 = "parse marker element";
                        uVar26 = 5;
                        uVar27 = 0x3b2;
                        goto LAB_0015ede2;
                      }
                      nodes[4] = uVar12;
                      uVar6 = ref_cell_add(local_a68->cell[6],nodes,&ntri);
                      if (uVar6 != 0) {
                        uStackY_ac0 = (ulong)uVar6;
                        pcVar33 = "tri";
                        uVar26 = 0x3b5;
                        goto LAB_0015b8bb;
                      }
                    }
                    else {
                      if (nquad != 5) {
                        printf("cell_type = %d\n");
                        pcVar33 = "unknown SU2/VTK MARKER ELEM type";
                        uVar26 = 0x3c2;
                        goto LAB_0015f135;
                      }
                      iVar4 = __isoc99_sscanf(key_pos,"%d %d %d %d",&nquad,nodes,nodes + 1,nodes + 2
                                             );
                      if (iVar4 != 4) {
                        lVar32 = (long)iVar4;
                        pcVar33 = "parse marker element";
                        uVar26 = 4;
                        uVar27 = 0x3a9;
                        goto LAB_0015ede2;
                      }
                      nodes[3] = uVar12;
                      uVar6 = ref_cell_add(local_a68->cell[3],nodes,&ntri);
                      if (uVar6 != 0) {
                        uStackY_ac0 = (ulong)uVar6;
                        pcVar33 = "tri";
                        uVar26 = 0x3ac;
                        goto LAB_0015b8bb;
                      }
                    }
                  }
                  uVar12 = uVar12 + 1;
                }
                pcVar33 = "unable to read marker tag";
                uVar26 = 0x398;
LAB_0015f135:
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,uVar26,"ref_import_su2",pcVar33);
              }
              else {
                uVar8 = atoi(pcVar33 + 1);
                printf("NELEM %d\n",(ulong)uVar8);
                if ((int)uVar8 < 1) {
                  uVar8 = 0;
                }
LAB_0015bfdd:
                bVar34 = uVar8 == 0;
                uVar8 = uVar8 - 1;
                if (bVar34) goto LAB_0015c383;
                pRVar15 = (REF_FILEPOS *)fgets((char *)key_pos,0x400,pFVar19);
                if (key_pos != pRVar15) {
                  pcVar33 = "unable to read element line";
                  uVar26 = 0x35a;
                  goto LAB_0015f135;
                }
                iVar4 = __isoc99_sscanf(key_pos,"%d",&nquad);
                if (iVar4 == 1) {
                  switch(nquad) {
                  case 5:
                    iVar4 = __isoc99_sscanf(key_pos,"%d %d %d %d",&nquad,nodes,nodes + 1,nodes + 2);
                    pRVar30 = local_a68;
                    if (iVar4 != 4) {
                      lVar32 = (long)iVar4;
                      pcVar33 = "parse marker element";
                      uVar26 = 4;
                      uVar27 = 0x381;
                      goto LAB_0015ede2;
                    }
                    nodes[3] = 0;
                    uVar12 = ref_cell_add(local_a68->cell[3],nodes,&ntri);
                    if (uVar12 != 0) {
                      uStackY_ac0 = (ulong)uVar12;
                      pcVar33 = "tri";
                      uVar26 = 899;
                      goto LAB_0015b8bb;
                    }
                    break;
                  default:
                    printf("cell_type = %d\n");
                    pcVar33 = "unknown SU2/VTK ELEM type";
                    uVar26 = 0x390;
                    goto LAB_0015f135;
                  case 9:
                    iVar4 = __isoc99_sscanf(key_pos,"%d %d %d %d %d",&nquad,nodes,nodes + 1,
                                            nodes + 2,nodes + 3);
                    pRVar30 = local_a68;
                    if (iVar4 != 5) {
                      lVar32 = (long)iVar4;
                      pcVar33 = "parse marker element";
                      uVar26 = 5;
                      uVar27 = 0x389;
                      goto LAB_0015ede2;
                    }
                    nodes[4] = 0;
                    uVar12 = ref_cell_add(local_a68->cell[6],nodes,&ntri);
                    if (uVar12 != 0) {
                      uStackY_ac0 = (ulong)uVar12;
                      pcVar33 = "tri";
                      uVar26 = 0x38b;
                      goto LAB_0015b8bb;
                    }
                    break;
                  case 10:
                    iVar4 = __isoc99_sscanf(key_pos,"%d %d %d %d %d",&nquad,nodes,nodes + 1,
                                            nodes + 2,nodes + 3);
                    pRVar30 = local_a68;
                    if (iVar4 != 5) {
                      lVar32 = (long)iVar4;
                      pcVar33 = "parse element";
                      uVar26 = 5;
                      uVar27 = 0x361;
                      goto LAB_0015ede2;
                    }
                    uVar12 = ref_cell_add(local_a68->cell[8],nodes,&ntri);
                    if (uVar12 != 0) {
                      uStackY_ac0 = (ulong)uVar12;
                      pcVar33 = "tet";
                      uVar26 = 0x362;
                      goto LAB_0015b8bb;
                    }
                    break;
                  case 0xc:
                    iVar4 = __isoc99_sscanf(key_pos,"%d %d %d %d %d %d %d %d %d",&nquad,nodes,
                                            nodes + 1,nodes + 2,nodes + 3,nodes + 4,nodes + 5,
                                            nodes + 6,nodes + 7);
                    pRVar30 = local_a68;
                    if (iVar4 != 9) {
                      lVar32 = (long)iVar4;
                      pcVar33 = "parse element";
                      uVar26 = 9;
                      uVar27 = 0x37a;
                      goto LAB_0015ede2;
                    }
                    uVar12 = ref_cell_add(local_a68->cell[0xb],nodes,&ntri);
                    if (uVar12 != 0) {
                      uStackY_ac0 = (ulong)uVar12;
                      pcVar33 = "tri";
                      uVar26 = 0x37b;
                      goto LAB_0015b8bb;
                    }
                    break;
                  case 0xd:
                    iVar4 = __isoc99_sscanf(key_pos,"%d %d %d %d %d %d %d",&nquad,nodes,nodes + 1,
                                            nodes + 2,nodes + 3,nodes + 4,nodes + 5);
                    RVar35 = nodes[3];
                    RVar36 = nodes[0];
                    pRVar30 = local_a68;
                    if (iVar4 != 7) {
                      lVar32 = (long)iVar4;
                      pcVar33 = "parse element";
                      uVar26 = 7;
                      uVar27 = 0x371;
                      goto LAB_0015ede2;
                    }
                    nodes[0] = nodes[1];
                    nodes[1] = RVar36;
                    nodes[3] = nodes[4];
                    nodes[4] = RVar35;
                    uVar12 = ref_cell_add(local_a68->cell[10],nodes,&ntri);
                    if (uVar12 != 0) {
                      uStackY_ac0 = (ulong)uVar12;
                      pcVar33 = "tri";
                      uVar26 = 0x373;
                      goto LAB_0015b8bb;
                    }
                    break;
                  case 0xe:
                    iVar4 = __isoc99_sscanf(key_pos,"%d %d %d %d %d %d",&nquad,nodes,nodes + 1,
                                            nodes + 2,nodes + 3,nodes + 4);
                    RVar37 = nodes[3];
                    RVar35 = nodes[2];
                    RVar36 = nodes[0];
                    pRVar30 = local_a68;
                    if (iVar4 != 6) {
                      lVar32 = (long)iVar4;
                      pcVar33 = "parse element";
                      uVar26 = 6;
                      uVar27 = 0x368;
                      goto LAB_0015ede2;
                    }
                    nodes[0] = nodes[1];
                    nodes[1] = RVar36;
                    nodes[2] = nodes[4];
                    nodes[3] = RVar35;
                    nodes[4] = RVar37;
                    uVar12 = ref_cell_add(local_a68->cell[9],nodes,&ntri);
                    if (uVar12 != 0) {
                      uStackY_ac0 = (ulong)uVar12;
                      pcVar33 = "pyr";
                      uVar26 = 0x36a;
                      goto LAB_0015b8bb;
                    }
                  }
                  goto LAB_0015bfdd;
                }
                lVar32 = (long)iVar4;
                pcVar33 = "parse element type";
                uVar26 = 1;
                uVar27 = 0x35b;
LAB_0015ede2:
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,uVar27,"ref_import_su2",pcVar33,uVar26,lVar32);
              }
              uStackY_ac0 = 1;
              goto LAB_0015f13f;
            }
          } while( true );
        }
        printf("unable to open %s\n",filename);
        pcVar33 = "unable to open file";
        uVar26 = 0x333;
LAB_0015d376:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               uVar26,"ref_import_su2",pcVar33);
        uStackY_ac0 = 2;
      }
      else {
        uStackY_ac0 = (ulong)uVar8;
        pcVar33 = "create grid";
        uVar26 = 0x32d;
LAB_0015b8bb:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               uVar26,"ref_import_su2",uStackY_ac0,pcVar33);
      }
LAB_0015f13f:
      pcVar33 = "su2 failed";
      uVar26 = 0x6ce;
      goto LAB_00161a8a;
    }
    iVar4 = strcmp(pcVar16,".msh");
    if (iVar4 == 0) {
      uVar8 = ref_grid_create(ref_grid_ptr,ref_mpi);
      if (uVar8 == 0) {
        pRVar30 = *ref_grid_ptr;
        pRVar21 = (REF_GRID_conflict)pRVar30->node;
        pFVar19 = fopen(filename,"r");
        if (pFVar19 != (FILE *)0x0) {
          local_a68 = (REF_GRID_conflict)(pRVar30->cell + 6);
          local_a38 = (REF_GRID_conflict)(pRVar30->cell + 2);
          local_9f8 = (REF_GRID_conflict)(pRVar30->cell + 5);
          local_9d8 = (REF_GRID_conflict)(pRVar30->cell + 0xc);
          local_9e0 = (REF_GRID_conflict)(pRVar30->cell + 4);
          local_9c0 = (REF_GRID_conflict)(pRVar30->cell + 1);
          local_9d0 = (REF_GRID_conflict)(pRVar30->cell + 9);
          local_918 = (REF_GRID_conflict)(pRVar30->cell + 10);
          local_920 = (REF_GRID_conflict)(pRVar30->cell + 0xb);
          local_928 = (REF_GRID_conflict)(pRVar30->cell + 8);
          pRVar22 = (REF_GRID_conflict)pRVar30->cell;
LAB_0015c7cb:
          iVar4 = feof(pFVar19);
          if (iVar4 != 0) goto LAB_0015e1d9;
          iVar4 = __isoc99_fscanf(pFVar19,"%s",key_pos);
          if (iVar4 != 1) {
            ref_grid_ptr = local_a30;
            if (iVar4 != -1) {
              uVar18 = (ulong)iVar4;
              pcVar33 = "line read failed";
              uVar20 = 1;
              uVar26 = 0x3eb;
              goto LAB_0015f30c;
            }
            goto LAB_00161a5b;
          }
          iVar4 = bcmp("Dimension",key_pos,10);
          if (iVar4 == 0) {
            iVar4 = __isoc99_fscanf(pFVar19,"%d",&nquad);
            if (iVar4 != 1) {
              uVar18 = (ulong)iVar4;
              pcVar33 = "read dim";
              uVar20 = 1;
              uVar26 = 0x3f0;
              goto LAB_0015f30c;
            }
            if (nquad == 2) {
              pRVar30->twod = 1;
            }
          }
          iVar4 = bcmp("Vertices",key_pos,9);
          if (iVar4 == 0) {
            iVar4 = __isoc99_fscanf(pFVar19,"%d",&new_cell);
            if (iVar4 != 1) {
              uVar18 = (ulong)iVar4;
              pcVar33 = "read nnode";
              uVar20 = 1;
              uVar26 = 0x3f5;
              goto LAB_0015f30c;
            }
            for (lVar32 = 0; lVar32 < new_cell; lVar32 = lVar32 + 1) {
              iVar4 = __isoc99_fscanf(pFVar19,"%lf %lf %d",&x,&y,&ntri);
              if (iVar4 != 3) {
                uVar18 = (ulong)iVar4;
                pcVar33 = "read xy";
                uVar20 = 3;
                uVar26 = 0x3f7;
                goto LAB_0015f30c;
              }
              uVar8 = ref_node_add((REF_NODE)pRVar21,lVar32,&nid);
              if (uVar8 != 0) {
                uStackY_ac0 = (ulong)uVar8;
                pcVar33 = "add node";
                uVar26 = 0x3f8;
                goto LAB_0015bada;
              }
              pRVar2 = pRVar21->cell[5];
              lVar25 = (long)nid * 0x78;
              *(ulong *)((long)pRVar2 + lVar25) =
                   CONCAT44(x._4_4_,CONCAT13(x._3_1_,CONCAT12(x._2_1_,CONCAT11(x._1_1_,x._0_1_))));
              *(ulong *)((long)pRVar2 + lVar25 + 8) = CONCAT44(y._4_4_,y._0_4_);
              *(undefined8 *)((long)pRVar2 + lVar25 + 0x10) = 0;
            }
            uVar8 = ref_node_initialize_n_global((REF_NODE)pRVar21,(long)new_cell);
            if (uVar8 != 0) {
              uStackY_ac0 = (ulong)uVar8;
              pcVar33 = "init glob";
              uVar26 = 0x3fd;
              goto LAB_0015bada;
            }
          }
          iVar4 = bcmp("Edges",key_pos,6);
          if (iVar4 == 0) {
            iVar4 = __isoc99_fscanf(pFVar19,"%d",&n0);
            if (iVar4 != 1) {
              uVar18 = (ulong)iVar4;
              pcVar33 = "read nedge";
              uVar20 = 1;
              uVar26 = 0x401;
              goto LAB_0015f30c;
            }
            iVar4 = -1;
            while (iVar4 = iVar4 + 1, iVar4 < n0) {
              iVar10 = __isoc99_fscanf(pFVar19,"%d %d %d",&n1,&n2,&id);
              if (iVar10 != 3) {
                uVar18 = (ulong)iVar10;
                pcVar33 = "read edge";
                uVar20 = 3;
                uVar26 = 0x403;
                goto LAB_0015f30c;
              }
              n1 = n1 + -1;
              n2 = n2 + -1;
              nodes[2] = id;
              nodes[0] = n1;
              nodes[1] = n2;
              uVar8 = ref_cell_add((REF_CELL)pRVar22->mpi,nodes,&new_cell_3);
              if (uVar8 != 0) {
                uStackY_ac0 = (ulong)uVar8;
                pcVar33 = "quad face for an edge";
                uVar26 = 0x40a;
                goto LAB_0015bada;
              }
            }
          }
          iVar4 = bcmp("Triangles",key_pos,10);
          if (iVar4 == 0) {
            iVar4 = __isoc99_fscanf(pFVar19,"%d",&ngeom);
            if (iVar4 != 1) {
              uVar18 = (ulong)iVar4;
              pcVar33 = "read ntri";
              uVar20 = 1;
              uVar26 = 0x40f;
              goto LAB_0015f30c;
            }
            iVar4 = -1;
            while (iVar4 = iVar4 + 1, iVar4 < ngeom) {
              iVar10 = __isoc99_fscanf(pFVar19,"%d %d %d %d",&n1,&n2,&n3,&id);
              if (iVar10 != 4) {
                uVar18 = (ulong)iVar10;
                pcVar33 = "read tri";
                uVar20 = 4;
                uVar26 = 0x411;
                goto LAB_0015f30c;
              }
              n1 = n1 + -1;
              n2 = n2 + -1;
              n3 = n3 + -1;
              nodes[3] = id;
              nodes[0] = n1;
              nodes[1] = n2;
              nodes[2] = n3;
              uVar8 = ref_cell_add((REF_CELL)((REF_GRID_conflict)(pRVar30->cell + 3))->mpi,nodes,
                                   &new_cell_3);
              if (uVar8 != 0) {
                uStackY_ac0 = (ulong)uVar8;
                pcVar33 = "tri face for tri";
                uVar26 = 0x41a;
                goto LAB_0015bada;
              }
            }
          }
          iVar4 = bcmp("Quadrilaterals",key_pos,0xf);
          if (iVar4 == 0) {
            iVar4 = __isoc99_fscanf(pFVar19,"%d",&ngeom);
            if (iVar4 != 1) {
              uVar18 = (ulong)iVar4;
              pcVar33 = "read ntri";
              uVar20 = 1;
              uVar26 = 0x41f;
              goto LAB_0015f30c;
            }
            iVar4 = -1;
            while (iVar4 = iVar4 + 1, iVar4 < ngeom) {
              iVar10 = __isoc99_fscanf(pFVar19,"%d %d %d %d %d",&n1,&n2,&n3,&new_cell_1,&id);
              if (iVar10 != 5) {
                uVar18 = (ulong)iVar10;
                pcVar33 = "read quad";
                uVar20 = 5;
                uVar26 = 0x422;
                goto LAB_0015f30c;
              }
              n1 = n1 + -1;
              n2 = n2 + -1;
              n3 = n3 + -1;
              new_cell_1 = new_cell_1 + -1;
              nodes[4] = id;
              nodes[0] = n1;
              nodes[1] = n2;
              nodes[2] = n3;
              nodes[3] = new_cell_1;
              uVar8 = ref_cell_add((REF_CELL)local_a68->mpi,nodes,&new_cell_3);
              if (uVar8 != 0) {
                uStackY_ac0 = (ulong)uVar8;
                pcVar33 = "qua face for qua";
                uVar26 = 0x42d;
                goto LAB_0015bada;
              }
            }
          }
          local_a48 = pRVar21;
          local_9b0 = pRVar22;
          iVar4 = bcmp("$MeshFormat",key_pos,0xc);
          if (iVar4 == 0) {
            iVar4 = __isoc99_fscanf(pFVar19,"%lf %d %d",&nnode,&filetype,&datasize);
            if (iVar4 == 3) {
              uVar18 = (ulong)filetype;
              if (uVar18 == 0) {
                uVar18 = (ulong)datasize;
                if (uVar18 == 8) {
                  printf("$MeshFormat %3.1f\n",CONCAT44(uStack_a54,nnode));
                  goto LAB_0015c946;
                }
                pcVar33 = "only doubles implemented";
                uVar20 = 8;
                uVar26 = 0x437;
              }
              else {
                pcVar33 = "only ASCII implemented";
                uVar26 = 0x436;
                uVar20 = 0;
              }
            }
            else {
              uVar18 = (ulong)iVar4;
              pcVar33 = "read version file-type data-size";
              uVar20 = 3;
              uVar26 = 0x435;
            }
            goto LAB_0015f30c;
          }
LAB_0015c946:
          iVar4 = bcmp("$Nodes",key_pos,7);
          if (iVar4 != 0) goto LAB_0015c960;
          iVar4 = __isoc99_fscanf(pFVar19,"%d %d %d %d",&nnode,&new_cell,&filetype,&datasize);
          if (iVar4 == 4) {
            local_9e8 = 0;
            printf("$Nodes\n%d %d %d %d\n",(ulong)(uint)nnode,(ulong)(uint)new_cell,
                   (ulong)(uint)filetype,(ulong)(uint)datasize);
            for (local_a28 = 0; local_a28 < nnode; local_a28 = local_a28 + 1) {
              iVar4 = __isoc99_fscanf(pFVar19,"%d %d %d %d",&entity_dim,&entity_tag,&parameric,&n);
              if (iVar4 != 4) {
                pcVar33 = 
                "numEntityBlocks(size_t) numNodes(size_t) minNodeTag(size_t) maxNodeTag(size_t)";
                uVar20 = 4;
                uVar26 = 0x449;
                uVar18 = (long)iVar4;
                goto LAB_0015f30c;
              }
              for (iVar4 = 0; iVar4 < n; iVar4 = iVar4 + 1) {
                iVar10 = __isoc99_fscanf(pFVar19,"%d",&node_tag);
                if (iVar10 != 1) {
                  pcVar33 = "node tag";
                  uVar20 = 1;
                  uVar26 = 0x44c;
                  uVar18 = (long)iVar10;
                  goto LAB_0015f30c;
                }
              }
              for (lVar32 = 0; uVar20 = local_9e8 + lVar32, (int)lVar32 < n; lVar32 = lVar32 + 1) {
                iVar4 = __isoc99_fscanf(pFVar19,"%lf %lf %lf",&x,&y,&new_node);
                pRVar21 = local_a48;
                if (iVar4 != 3) {
                  pcVar33 = "node tag";
                  uVar20 = 3;
                  uVar26 = 0x44f;
                  uVar18 = (long)iVar4;
                  goto LAB_0015f30c;
                }
                uVar8 = ref_node_add((REF_NODE)local_a48,uVar20,&nid);
                if (uVar8 != 0) {
                  uStackY_ac0 = (ulong)uVar8;
                  pcVar33 = "add node";
                  uVar26 = 0x450;
                  goto LAB_0015bada;
                }
                pRVar2 = pRVar21->cell[5];
                lVar25 = (long)nid * 0x78;
                *(ulong *)((long)pRVar2 + lVar25) =
                     CONCAT44(x._4_4_,CONCAT13(x._3_1_,CONCAT12(x._2_1_,CONCAT11(x._1_1_,x._0_1_))))
                ;
                *(ulong *)((long)pRVar2 + lVar25 + 8) = CONCAT44(y._4_4_,y._0_4_);
                *(ulong *)((long)pRVar2 + lVar25 + 0x10) = CONCAT44(uStack_a4c,new_node);
              }
              local_9e8 = uVar20;
            }
            uVar20 = (ulong)new_cell;
            if (local_9e8 != uVar20) {
              pcVar33 = "node count";
              uVar26 = 0x457;
              uVar18 = local_9e8;
              goto LAB_0015f30c;
            }
            uVar8 = ref_node_initialize_n_global((REF_NODE)local_a48,local_9e8);
            if (uVar8 == 0) goto LAB_0015c960;
            uStackY_ac0 = (ulong)uVar8;
            pcVar33 = "init glob";
            uVar26 = 0x458;
            goto LAB_0015bada;
          }
          uVar18 = (ulong)iVar4;
          pcVar33 = "n entity bloc, nnode, min/max tag";
          uVar20 = 4;
          uVar26 = 0x440;
          goto LAB_0015f30c;
        }
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x3e6,"ref_import_msh","unable to open file");
        uStackY_ac0 = 2;
      }
      else {
        uStackY_ac0 = (ulong)uVar8;
        pcVar33 = "create grid";
        uVar26 = 0x3e0;
LAB_0015bada:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               uVar26,"ref_import_msh",uStackY_ac0,pcVar33);
      }
      goto LAB_0015f316;
    }
    iVar4 = strcmp(__s1,".node");
    if (iVar4 != 0) {
      iVar4 = strcmp(pcVar33,".meshb");
      if (iVar4 != 0) {
        iVar4 = strcmp(__s1,".grid");
        if (iVar4 == 0) {
          uVar8 = ref_grid_create(ref_grid_ptr,ref_mpi);
          if (uVar8 == 0) {
            uStackY_ac0 = 2;
            local_a68 = *ref_grid_ptr;
            pRVar1 = local_a68->node;
            local_a68->twod = 1;
            pFVar19 = fopen(filename,"r");
            if (pFVar19 == (FILE *)0x0) {
              printf("unable to open %s\n",filename);
              pcVar33 = "unable to open file";
              uVar26 = 0x51c;
LAB_0015d9e6:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,uVar26,"ref_import_i_like_cfd_grid",pcVar33);
            }
            else {
              iVar4 = __isoc99_fscanf(pFVar19,"%d %d %d\n",&nnode,&ntri,&nquad);
              if (iVar4 != 3) {
                lVar32 = (long)iVar4;
                pcVar33 = "read nnode ntri nquad";
                uStackY_ac0 = 3;
                uVar26 = 0x51f;
                goto LAB_0015e0d7;
              }
              local_a48 = (REF_GRID_conflict)CONCAT44(local_a48._4_4_,0xffffffff);
              for (lVar32 = 0; lVar32 < nnode; lVar32 = lVar32 + 1) {
                iVar4 = __isoc99_fscanf(pFVar19,"%lf %lf",&x,&y);
                if (iVar4 != 2) {
                  lVar32 = (long)iVar4;
                  pcVar33 = "read xy";
                  uStackY_ac0 = 2;
                  uVar26 = 0x522;
                  goto LAB_0015e0d7;
                }
                uVar8 = ref_node_add(pRVar1,lVar32,&new_node);
                if (uVar8 != 0) {
                  pcVar33 = "add node";
                  uVar26 = 0x523;
                  goto LAB_0015e15a;
                }
                pRVar17 = pRVar1->real;
                lVar25 = (long)new_node;
                pRVar17[lVar25 * 0xf] =
                     (REF_DBL)CONCAT44(x._4_4_,CONCAT13(x._3_1_,CONCAT12(x._2_1_,CONCAT11(x._1_1_,x.
                                                  _0_1_))));
                pRVar17[lVar25 * 0xf + 1] = (REF_DBL)CONCAT44(y._4_4_,y._0_4_);
                pRVar17[lVar25 * 0xf + 2] = 0.0;
              }
              uVar8 = ref_node_initialize_n_global(pRVar1,(long)nnode);
              if (uVar8 == 0) {
                do {
                  iVar4 = (int)local_a48 + 1;
                  local_a48 = (REF_GRID_conflict)CONCAT44(local_a48._4_4_,iVar4);
                  if (ntri <= iVar4) {
                    iVar4 = -1;
                    goto LAB_0015ebaa;
                  }
                  iVar4 = __isoc99_fscanf(pFVar19,"%d %d %d",&n0,&n1,&n2);
                  if (iVar4 != 3) {
                    lVar32 = (long)iVar4;
                    pcVar33 = "read tri";
                    uStackY_ac0 = 3;
                    uVar26 = 0x52d;
                    goto LAB_0015e0d7;
                  }
                  nodes[0] = n0 + -1;
                  nodes[1] = n1 + -1;
                  nodes[2] = n2 + -1;
                  nodes[3] = 1;
                  uVar8 = ref_cell_add(local_a68->cell[3],nodes,&new_cell);
                } while (uVar8 == 0);
                pcVar33 = "tri face for tri";
                uVar26 = 0x533;
                goto LAB_0015e15a;
              }
              pcVar33 = "init glob";
              uVar26 = 0x528;
LAB_0015dfbc:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,uVar26,"ref_import_i_like_cfd_grid",(ulong)uVar8,pcVar33);
              uStackY_ac0 = (ulong)uVar8;
            }
          }
          else {
            uStackY_ac0 = (ulong)uVar8;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x514,"ref_import_i_like_cfd_grid",(ulong)uVar8,"create grid");
          }
          goto LAB_0015e167;
        }
        iVar4 = strcmp(pcVar16,".avm");
        if (iVar4 != 0) {
          uStackY_ac0 = 1;
          printf("%s: %d: %s %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x6dc,"input file name extension unknown",filename);
          pcVar33 = "unknown file extension";
          uVar26 = 0x6de;
          goto LAB_00161a8a;
        }
        uVar8 = ref_part_by_extension(ref_grid_ptr,ref_mpi,filename);
        if (uVar8 != 0) {
          uStackY_ac0 = (ulong)uVar8;
          pcVar33 = "part failed";
          uVar26 = 0x6da;
          goto LAB_00161a8a;
        }
        goto LAB_00161a5b;
      }
      uVar8 = ref_import_meshb_header(filename,&ntri,key_pos);
      if (uVar8 == 0) {
        uVar8 = ref_grid_create(ref_grid_ptr,ref_mpi);
        if (uVar8 == 0) {
          pRVar30 = *ref_grid_ptr;
          pRVar1 = pRVar30->node;
          ref_geom = pRVar30->geom;
          pFVar19 = fopen(filename,"r");
          RVar36 = ntri;
          if (pFVar19 == (FILE *)0x0) {
            printf("unable to open %s\n",filename);
            pcVar33 = "unable to open file";
            uVar26 = 0x61e;
            goto LAB_0015dc57;
          }
          uVar8 = ref_import_meshb_jump
                            ((FILE *)pFVar19,ntri,key_pos,3,&new_cell,(REF_FILEPOS *)&new_node);
          if (uVar8 != 0) {
            uStackY_ac0 = (ulong)uVar8;
            pcVar33 = "jump";
            uVar26 = 0x622;
            goto LAB_0015d441;
          }
          if (new_cell == 0) {
            pcVar33 = "meshb missing dimension";
            uVar26 = 0x623;
LAB_0015e3dc:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,uVar26,"ref_import_meshb",pcVar33);
          }
          else {
            sVar13 = fread(&nquad,4,1,pFVar19);
            RVar35 = nquad;
            if (sVar13 != 1) {
              pcVar33 = "dim";
              sVar29 = 1;
              uVar26 = 0x624;
              goto LAB_0015e45c;
            }
            if (nquad - 4U < 0xfffffffe) {
              printf("dim %d not supported\n",(ulong)(uint)nquad);
              pcVar33 = "dim";
              uVar26 = 0x628;
              goto LAB_0015e3dc;
            }
            if (nquad == 2) {
              pRVar30->twod = 1;
            }
            uVar8 = ref_import_meshb_jump
                              ((FILE *)pFVar19,RVar36,key_pos,4,&new_cell,(REF_FILEPOS *)&new_node);
            if (uVar8 != 0) {
              uStackY_ac0 = (ulong)uVar8;
              pcVar33 = "jump";
              uVar26 = 0x62e;
              goto LAB_0015d441;
            }
            if (new_cell == 0) {
              pcVar33 = "meshb missing vertex";
              uVar26 = 0x62f;
              goto LAB_0015e3dc;
            }
            uVar8 = ref_import_meshb_int((FILE *)pFVar19,RVar36,&n0);
            if (uVar8 == 0) {
              local_a38 = (REF_GRID_conflict)(long)n0;
              local_a68 = (REF_GRID_conflict)0x0;
              local_a48 = (REF_GRID_conflict)0x0;
              if (0 < n0) {
                local_a48 = (REF_GRID_conflict)(ulong)(uint)n0;
              }
              do {
                if (local_a48 == local_a68) {
                  sVar29 = CONCAT44(uStack_a4c,new_node);
                  sVar13 = ftello(pFVar19);
                  if (sVar29 != sVar13) {
                    pcVar33 = "end location";
                    uVar26 = 0x645;
                    goto LAB_0015e45c;
                  }
                  uVar8 = ref_node_initialize_n_global(pRVar1,(REF_GLOB)local_a38);
                  if (uVar8 == 0) {
                    local_a68 = (REF_GRID_conflict)0x0;
                    goto LAB_0016041e;
                  }
                  uStackY_ac0 = (ulong)uVar8;
                  pcVar33 = "init glob";
                  uVar26 = 0x647;
                  goto LAB_0015d441;
                }
                uVar8 = ref_node_add(pRVar1,(REF_GLOB)local_a68,&n2);
                if (uVar8 != 0) {
                  uStackY_ac0 = (ulong)uVar8;
                  pcVar33 = "add node";
                  uVar26 = 0x634;
                  goto LAB_0015d441;
                }
                uVar8 = meshb_real((FILE *)pFVar19,RVar36,pRVar1->real + (long)n2 * 0xf);
                if (RVar35 == 2) {
                  if (uVar8 != 0) {
                    pcVar33 = "x";
                    uStackY_ac0 = 1;
                    uVar26 = 0x637;
                    goto LAB_0015d441;
                  }
                  RVar11 = meshb_real((FILE *)pFVar19,RVar36,pRVar1->real + (long)n2 * 0xf + 1);
                  if (RVar11 != 0) {
                    pcVar33 = "y";
                    uStackY_ac0 = 1;
                    uVar26 = 0x639;
                    goto LAB_0015d441;
                  }
                  pRVar1->real[(long)n2 * 0xf + 2] = 0.0;
                }
                else {
                  if (uVar8 != 0) {
                    pcVar33 = "x";
                    uVar26 = 0x63d;
                    goto LAB_0015f0bf;
                  }
                  RVar11 = meshb_real((FILE *)pFVar19,RVar36,pRVar1->real + (long)n2 * 0xf + 1);
                  if (RVar11 != 0) {
                    pcVar33 = "y";
                    uStackY_ac0 = 1;
                    uVar26 = 0x63f;
                    goto LAB_0015d441;
                  }
                  RVar11 = meshb_real((FILE *)pFVar19,RVar36,pRVar1->real + (long)n2 * 0xf + 2);
                  if (RVar11 != 0) {
                    pcVar33 = "z";
                    uStackY_ac0 = 1;
                    uVar26 = 0x641;
                    goto LAB_0015d441;
                  }
                }
                RVar11 = ref_import_meshb_int((FILE *)pFVar19,RVar36,&id);
                local_a68 = (REF_GRID_conflict)((long)&local_a68->mpi + 1);
              } while (RVar11 == 0);
              pcVar33 = "nnode";
              uStackY_ac0 = 1;
              uVar26 = 0x643;
              goto LAB_0015d441;
            }
            pcVar33 = "nnode";
            uVar26 = 0x630;
LAB_0015f0bf:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,uVar26,"ref_import_meshb",(ulong)uVar8,pcVar33);
          }
          goto LAB_0015e463;
        }
        uStackY_ac0 = (ulong)uVar8;
        pcVar33 = "create grid";
        uVar26 = 0x616;
      }
      else {
        uStackY_ac0 = (ulong)uVar8;
        pcVar33 = "header";
        uVar26 = 0x613;
      }
LAB_0015d441:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             uVar26,"ref_import_meshb",uStackY_ac0,pcVar33);
      goto LAB_0015d44b;
    }
    sVar29 = 0x3fa;
    if (sVar13 < 0x400) {
      sVar29 = sVar13 - 5;
    }
    iVar4 = strncmp(filename + sVar29,".node",5);
    if (iVar4 != 0) {
      lVar32 = (long)iVar4;
      pcVar33 = "filename does not end in .node";
      uVar26 = 0x4c5;
      goto LAB_0015bd08;
    }
    memcpy(nodes,filename,sVar29);
    *(undefined1 *)((long)nodes + sVar29) = 0;
    uVar8 = ref_grid_create(ref_grid_ptr,ref_mpi);
    if (uVar8 != 0) {
      uStackY_ac0 = (ulong)uVar8;
      pcVar33 = "create grid";
      uVar26 = 0x4cb;
      goto LAB_0015d314;
    }
    pRVar30 = *ref_grid_ptr;
    pRVar1 = pRVar30->node;
    pFVar19 = fopen(filename,"r");
    if (pFVar19 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      uVar26 = 0x4d1;
      goto LAB_0015da24;
    }
    iVar4 = __isoc99_fscanf(pFVar19,"%d",&new_node);
    if (iVar4 == 1) {
      iVar4 = __isoc99_fscanf(pFVar19,"%d",&nnode);
      if (iVar4 != 1) {
        lVar32 = (long)iVar4;
        pcVar33 = "node header ndim";
        uStackY_ac0 = 1;
        uVar26 = 0x4d4;
        goto LAB_0015bd0b;
      }
      lVar32 = (long)nnode;
      if (lVar32 != 3) {
        pcVar33 = "not 3D";
        uStackY_ac0 = 3;
        uVar26 = 0x4d5;
        goto LAB_0015bd0b;
      }
      iVar4 = __isoc99_fscanf(pFVar19,"%d",&ntri);
      if (iVar4 != 1) {
        lVar32 = (long)iVar4;
        pcVar33 = "node header attr";
        uStackY_ac0 = 1;
        uVar26 = 0x4d6;
        goto LAB_0015bd0b;
      }
      lVar32 = (long)ntri;
      if (lVar32 != 0) {
        pcVar33 = "nodes have attribute 3D";
        uVar26 = 0x4d7;
LAB_0015bd08:
        uStackY_ac0 = 0;
        goto LAB_0015bd0b;
      }
      iVar4 = __isoc99_fscanf(pFVar19,"%d",&nquad);
      if (iVar4 != 1) {
        lVar32 = (long)iVar4;
        pcVar33 = "node header mark";
        uStackY_ac0 = 1;
        uVar26 = 0x4d8;
        goto LAB_0015bd0b;
      }
      lVar32 = (long)nquad;
      if (lVar32 != 0) {
        pcVar33 = "nodes have mark";
        uVar26 = 0x4d9;
        goto LAB_0015bd08;
      }
      uStackY_ac0 = 0;
      while( true ) {
        if ((long)new_node <= (long)uStackY_ac0) goto LAB_0015fcec;
        iVar4 = __isoc99_fscanf(pFVar19,"%d",&new_cell);
        if (iVar4 != 1) {
          lVar32 = (long)iVar4;
          pcVar33 = "node item";
          uStackY_ac0 = 1;
          uVar26 = 0x4dc;
          goto LAB_0015bd0b;
        }
        if (uStackY_ac0 != (uint)new_cell) {
          lVar32 = (long)new_cell;
          pcVar33 = "file node index";
          uVar26 = 0x4dd;
          goto LAB_0015bd0b;
        }
        uVar8 = ref_node_add(pRVar1,uStackY_ac0,&nid);
        if (uVar8 != 0) {
          uStackY_ac0 = (ulong)uVar8;
          pcVar33 = "add node";
          uVar26 = 0x4de;
          goto LAB_0015d314;
        }
        if (uStackY_ac0 != (uint)nid) break;
        iVar4 = __isoc99_fscanf(pFVar19,"%lf",&y);
        if (iVar4 != 1) {
          pcVar33 = "x";
          uVar26 = 0x4e0;
          goto LAB_0015fff3;
        }
        iVar4 = __isoc99_fscanf(pFVar19,"%lf",&local_a10);
        if (iVar4 != 1) {
          pcVar33 = "y";
          uVar26 = 0x4e1;
          goto LAB_0015fff3;
        }
        iVar4 = __isoc99_fscanf(pFVar19,"%lf",local_a08);
        if (iVar4 != 1) {
          pcVar33 = "z";
          uVar26 = 0x4e2;
          goto LAB_0015fff3;
        }
        pRVar17 = pRVar1->real;
        lVar32 = (long)nid;
        pRVar17[lVar32 * 0xf] = (REF_DBL)CONCAT44(y._4_4_,y._0_4_);
        pRVar17[lVar32 * 0xf + 1] = local_a10;
        pRVar17[lVar32 * 0xf + 2] = local_a08[0];
        uStackY_ac0 = uStackY_ac0 + 1;
      }
      pcVar33 = "node index";
      uVar26 = 0x4df;
LAB_0015fff3:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             uVar26,"ref_import_tetgen_node",pcVar33);
    }
    else {
      lVar32 = (long)iVar4;
      pcVar33 = "node header nnode";
      uStackY_ac0 = 1;
      uVar26 = 0x4d3;
LAB_0015bd0b:
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             uVar26,"ref_import_tetgen_node",pcVar33,uStackY_ac0,lVar32);
    }
    uStackY_ac0 = 1;
    goto LAB_0015d31e;
  }
  uVar8 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar8 == 0) {
    pRVar30 = *ref_grid_ptr;
    pRVar1 = pRVar30->node;
    pFVar19 = fopen(filename,"r");
    if (pFVar19 != (FILE *)0x0) {
      iVar4 = __isoc99_fscanf(pFVar19,"%d",&x);
      if (iVar4 == 1) {
        iVar4 = __isoc99_fscanf(pFVar19,"%d",&y);
        if (iVar4 == 1) {
          iVar4 = __isoc99_fscanf(pFVar19,"%d",&new_node);
          if (iVar4 == 1) {
            iVar4 = __isoc99_fscanf(pFVar19,"%d",&nnode);
            if (iVar4 == 1) {
              iVar4 = __isoc99_fscanf(pFVar19,"%d",&ntri);
              if (iVar4 == 1) {
                iVar4 = __isoc99_fscanf(pFVar19,"%d",&nquad);
                if (iVar4 == 1) {
                  iVar4 = __isoc99_fscanf(pFVar19,"%d",&new_cell);
                  if (iVar4 == 1) {
                    if (0 < ref_mpi->timing) {
                      ref_mpi_stopwatch_stop(ref_mpi,"ugrid header");
                    }
                    for (uVar20 = 0;
                        lVar32 = (long)CONCAT13(x._3_1_,CONCAT12(x._2_1_,CONCAT11(x._1_1_,x._0_1_)))
                        , (long)uVar20 < lVar32; uVar20 = uVar20 + 1) {
                      uVar8 = ref_node_add(pRVar1,uVar20,&nid);
                      if (uVar8 != 0) {
                        uStackY_ac0 = (ulong)uVar8;
                        pcVar33 = "new_node";
                        uVar26 = 0x104;
                        goto LAB_0015b09e;
                      }
                      if (uVar20 != (uint)nid) {
                        pcVar33 = "node index";
                        uVar26 = 0x105;
                        goto LAB_0015dcf8;
                      }
                      iVar4 = __isoc99_fscanf(pFVar19,"%lf",nodes);
                      if (iVar4 != 1) {
                        pcVar33 = "x";
                        uVar26 = 0x106;
                        goto LAB_0015dcf8;
                      }
                      iVar4 = __isoc99_fscanf(pFVar19,"%lf",nodes + 2);
                      if (iVar4 != 1) {
                        pcVar33 = "y";
                        uVar26 = 0x107;
                        goto LAB_0015dcf8;
                      }
                      iVar4 = __isoc99_fscanf(pFVar19,"%lf",nodes + 4);
                      if (iVar4 != 1) {
                        pcVar33 = "z";
                        uVar26 = 0x108;
                        goto LAB_0015dcf8;
                      }
                      pRVar17 = pRVar1->real;
                      lVar32 = (long)nid;
                      pRVar17[lVar32 * 0xf] = (REF_DBL)CONCAT44(nodes[1],nodes[0]);
                      pRVar17[lVar32 * 0xf + 1] = (REF_DBL)CONCAT44(nodes[3],nodes[2]);
                      pRVar17[lVar32 * 0xf + 2] = (REF_DBL)CONCAT44(nodes[5],nodes[4]);
                    }
                    uVar8 = ref_node_initialize_n_global(pRVar1,lVar32);
                    if (uVar8 != 0) {
                      uStackY_ac0 = (ulong)uVar8;
                      pcVar33 = "init glob";
                      uVar26 = 0x10e;
                      goto LAB_0015b09e;
                    }
                    if (0 < ref_mpi->timing) {
                      ref_mpi_stopwatch_stop(ref_mpi,"ugrid node");
                    }
                    pRVar2 = pRVar30->cell[3];
                    key_pos[1]._4_4_ = -1;
                    iVar4 = 0;
                    do {
                      if ((int)y._0_4_ <= iVar4) {
                        pRVar2 = pRVar30->cell[6];
                        key_pos[2] = CONCAT44(key_pos[2]._4_4_,0xffffffff);
                        iVar4 = 0;
                        goto LAB_0015f9c3;
                      }
                      lVar32 = 0;
                      while (lVar32 + 4 != 0x10) {
                        iVar10 = __isoc99_fscanf(pFVar19,"%d",(long)key_pos + lVar32);
                        lVar32 = lVar32 + 4;
                        if (iVar10 != 1) {
                          pcVar33 = "tri";
                          uVar26 = 0x116;
                          goto LAB_0015dcf8;
                        }
                      }
                      key_pos[0] = CONCAT44((int)((ulong)key_pos[0] >> 0x20) + -1,
                                            (int)key_pos[0] + -1);
                      key_pos[1]._0_4_ = (int)key_pos[1] + -1;
                      uVar8 = ref_cell_add(pRVar2,(REF_INT *)key_pos,&n0);
                      if (uVar8 != 0) {
                        uStackY_ac0 = (ulong)uVar8;
                        pcVar33 = "new tri";
                        uVar26 = 0x11a;
                        goto LAB_0015b09e;
                      }
                      bVar34 = iVar4 == n0;
                      iVar4 = iVar4 + 1;
                    } while (bVar34);
                    pcVar33 = "tri index";
                    uVar26 = 0x11b;
                  }
                  else {
                    pcVar33 = "nhex";
                    uVar26 = 0xff;
                  }
                }
                else {
                  pcVar33 = "npri";
                  uVar26 = 0xfe;
                }
              }
              else {
                pcVar33 = "npyr";
                uVar26 = 0xfd;
              }
            }
            else {
              pcVar33 = "ntet";
              uVar26 = 0xfc;
            }
          }
          else {
            pcVar33 = "nqua";
            uVar26 = 0xfb;
          }
        }
        else {
          pcVar33 = "ntri";
          uVar26 = 0xfa;
        }
      }
      else {
        pcVar33 = "nnode";
        uVar26 = 0xf9;
      }
      goto LAB_0015dcf8;
    }
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0xf7,
           "ref_import_ugrid","unable to open file");
    uStackY_ac0 = 2;
  }
  else {
    uStackY_ac0 = (ulong)uVar8;
    pcVar33 = "create grid";
    uVar26 = 0xf1;
LAB_0015b09e:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar26
           ,"ref_import_ugrid",uStackY_ac0,pcVar33);
  }
  goto LAB_0015dd02;
  while (bVar34 = iVar4 == n1, iVar4 = iVar4 + 1, bVar34) {
LAB_001607d9:
    if (iVar4 == (int)local_a48) {
      pRVar2 = pRVar30->cell[3];
      iVar4 = 0;
      goto LAB_00160d70;
    }
    uVar8 = *(REF_INT *)((long)&local_9d0->node + 4);
    if ((int)uVar8 < 1) {
      uVar8 = 0;
    }
    for (lVar32 = 0; (ulong)uVar8 * 4 != lVar32; lVar32 = lVar32 + 4) {
      sVar13 = fread((void *)((long)key_pos + lVar32),4,1,pFVar19);
      if (sVar13 != 1) {
        pcVar33 = "qua";
        uVar26 = 0x2ce;
        goto LAB_0015b877;
      }
      uVar12 = *(uint *)((long)key_pos + lVar32);
      *(uint *)((long)key_pos + lVar32) =
           (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18) - 1
      ;
    }
    uVar8 = ref_cell_add((REF_CELL)local_9d0,(REF_INT *)key_pos,&n1);
    if (uVar8 != 0) {
      uStackY_ac0 = (ulong)uVar8;
      pcVar33 = "new qua";
      uVar26 = 0x2d2;
      goto LAB_0015b057;
    }
  }
  pcVar33 = "qua index";
  uVar26 = 0x2d3;
  goto LAB_0015b877;
LAB_00160d70:
  if ((int)local_a68 == iVar4) goto LAB_00160f16;
  sVar13 = fread(&n2,4,1,pFVar19);
  if (sVar13 != 1) {
    pcVar33 = "tri";
    uVar26 = 0x2d8;
    goto LAB_0015b877;
  }
  n2 = (uint)n2 >> 0x18 | (n2 & 0xff0000U) >> 8 | (n2 & 0xff00U) << 8 | n2 << 0x18;
  pRVar2->c2n[(long)iVar4 * (long)pRVar2->size_per + 3] = n2;
  iVar4 = iVar4 + 1;
  goto LAB_00160d70;
LAB_00160f16:
  pRVar2 = pRVar30->cell[6];
  for (iVar4 = 0; (int)local_a48 != iVar4; iVar4 = iVar4 + 1) {
    sVar13 = fread(&n2,4,1,pFVar19);
    if (sVar13 != 1) {
      pcVar33 = "qua";
      uVar26 = 0x2df;
      goto LAB_0015b877;
    }
    n2 = (uint)n2 >> 0x18 | (n2 & 0xff0000U) >> 8 | (n2 & 0xff00U) << 8 | n2 << 0x18;
    pRVar2->c2n[(long)iVar4 * (long)pRVar2->size_per + 4] = n2;
  }
  local_a68 = (REF_GRID_conflict)pRVar30->cell[8];
  iVar4 = (int)local_a38;
  local_a38 = (REF_GRID_conflict)((ulong)local_a38 & 0xffffffff);
  if (iVar4 < 1) {
    local_a38 = (REF_GRID_conflict)0x0;
  }
  iVar4 = 0;
  do {
    if (iVar4 == (int)local_a38) {
      local_a68 = (REF_GRID_conflict)pRVar30->cell[9];
      iVar4 = (int)local_9f8;
      local_9f8 = (REF_GRID_conflict)((ulong)local_9f8 & 0xffffffff);
      if (iVar4 < 1) {
        local_9f8 = (REF_GRID_conflict)0x0;
      }
      iVar4 = 0;
      goto LAB_00161577;
    }
    uVar8 = *(REF_INT *)((long)&local_a68->node + 4);
    if ((int)uVar8 < 1) {
      uVar8 = 0;
    }
    for (lVar32 = 0; (ulong)uVar8 * 4 != lVar32; lVar32 = lVar32 + 4) {
      sVar13 = fread((void *)((long)key_pos + lVar32),4,1,pFVar19);
      if (sVar13 != 1) {
        pcVar33 = "tet";
        uVar26 = 0x2e8;
        goto LAB_0015b877;
      }
      uVar12 = *(uint *)((long)key_pos + lVar32);
      *(uint *)((long)key_pos + lVar32) =
           (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18) - 1
      ;
    }
    uVar8 = ref_cell_add((REF_CELL)local_a68,(REF_INT *)key_pos,&n3);
    if (uVar8 != 0) {
      uStackY_ac0 = (ulong)uVar8;
      pcVar33 = "tet cell";
      uVar26 = 0x2ec;
      goto LAB_0015b057;
    }
    bVar34 = iVar4 == n3;
    iVar4 = iVar4 + 1;
  } while (bVar34);
  pcVar33 = "tet index";
  uVar26 = 0x2ed;
  goto LAB_0015b877;
  while( true ) {
    uVar8 = *(REF_INT *)((long)&local_a68->node + 4);
    if ((int)uVar8 < 1) {
      uVar8 = 0;
    }
    for (lVar32 = 0; (ulong)uVar8 * 4 != lVar32; lVar32 = lVar32 + 4) {
      sVar13 = fread((void *)((long)key_pos + lVar32),4,1,pFVar19);
      if (sVar13 != 1) {
        pcVar33 = "pyr";
        uVar26 = 0x2f4;
        goto LAB_0015b877;
      }
      uVar12 = *(uint *)((long)key_pos + lVar32);
      *(uint *)((long)key_pos + lVar32) =
           (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18) - 1
      ;
    }
    uVar8 = ref_cell_add((REF_CELL)local_a68,(REF_INT *)key_pos,&n3);
    if (uVar8 != 0) {
      uStackY_ac0 = (ulong)uVar8;
      pcVar33 = "pyr cell";
      uVar26 = 0x2f8;
      goto LAB_0015b057;
    }
    bVar34 = iVar4 != n3;
    iVar4 = iVar4 + 1;
    if (bVar34) break;
LAB_00161577:
    if (iVar4 == (int)local_9f8) {
      local_a68 = (REF_GRID_conflict)pRVar30->cell[10];
      iVar4 = (int)local_9d8;
      local_9d8 = (REF_GRID_conflict)((ulong)local_9d8 & 0xffffffff);
      if (iVar4 < 1) {
        local_9d8 = (REF_GRID_conflict)0x0;
      }
      iVar4 = 0;
      goto LAB_0016191c;
    }
  }
  pcVar33 = "pyr index";
  uVar26 = 0x2f9;
  goto LAB_0015b877;
  while( true ) {
    uVar8 = *(REF_INT *)((long)&local_a68->node + 4);
    if ((int)uVar8 < 1) {
      uVar8 = 0;
    }
    for (lVar32 = 0; (ulong)uVar8 * 4 != lVar32; lVar32 = lVar32 + 4) {
      sVar13 = fread((void *)((long)key_pos + lVar32),4,1,pFVar19);
      if (sVar13 != 1) {
        pcVar33 = "pri";
        uVar26 = 0x300;
        goto LAB_0015b877;
      }
      uVar12 = *(uint *)((long)key_pos + lVar32);
      *(uint *)((long)key_pos + lVar32) =
           (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18) - 1
      ;
    }
    uVar8 = ref_cell_add((REF_CELL)local_a68,(REF_INT *)key_pos,&n3);
    if (uVar8 != 0) {
      uStackY_ac0 = (ulong)uVar8;
      pcVar33 = "pri cell";
      uVar26 = 0x304;
      goto LAB_0015b057;
    }
    bVar34 = iVar4 != n3;
    iVar4 = iVar4 + 1;
    if (bVar34) break;
LAB_0016191c:
    if (iVar4 == (int)local_9d8) {
      pRVar2 = pRVar30->cell[0xb];
      iVar4 = (int)local_9e0;
      if ((int)local_9e0 < 1) {
        iVar4 = 0;
      }
      local_9e0 = (REF_GRID_conflict)CONCAT44(local_9e0._4_4_,iVar4);
      iVar4 = 0;
      goto LAB_00161afd;
    }
  }
  pcVar33 = "pri index";
  uVar26 = 0x305;
  goto LAB_0015b877;
  while( true ) {
    uVar8 = pRVar2->node_per;
    if ((int)uVar8 < 1) {
      uVar8 = 0;
    }
    for (lVar32 = 0; (ulong)uVar8 * 4 != lVar32; lVar32 = lVar32 + 4) {
      sVar13 = fread((void *)((long)key_pos + lVar32),4,1,pFVar19);
      if (sVar13 != 1) {
        pcVar33 = "hex";
        uVar26 = 0x30c;
        goto LAB_0015b877;
      }
      uVar12 = *(uint *)((long)key_pos + lVar32);
      *(uint *)((long)key_pos + lVar32) =
           (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18) - 1
      ;
    }
    uVar8 = ref_cell_add(pRVar2,(REF_INT *)key_pos,&n3);
    if (uVar8 != 0) {
      uStackY_ac0 = (ulong)uVar8;
      pcVar33 = "hex cell";
      uVar26 = 0x310;
      goto LAB_0015b057;
    }
    bVar34 = iVar4 != n3;
    iVar4 = iVar4 + 1;
    if (bVar34) break;
LAB_00161afd:
    if (iVar4 == (int)local_9e0) {
      sVar13 = fread(&new_cell_1,4,1,pFVar19);
      if (sVar13 != 1) {
        pcVar33 = "nnode";
        uVar26 = 0x314;
        goto LAB_0015b877;
      }
      pRVar21 = (REF_GRID_conflict)
                ((ulong)new_cell_1._2_1_ << 8 |
                 (long)(new_cell_1 << 0x18) | (ulong)new_cell_1._1_1_ << 0x10 |
                (ulong)new_cell_1._3_1_);
      if ((int)local_9c0 == (int)pRVar21) goto LAB_00161a4e;
      uStackY_ac0 = (ulong)(int)local_9c0;
      pcVar33 = "block end record size";
      uVar26 = 0x318;
      goto LAB_0015bb12;
    }
  }
  pcVar33 = "hex index";
  uVar26 = 0x311;
LAB_0015b877:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar26,
         "ref_import_r8_ugrid",pcVar33);
LAB_0015bb19:
  uStackY_ac0 = 1;
LAB_0015bb1c:
  pcVar33 = "r8_ugrid failed";
  uVar26 = 0x6c4;
  goto LAB_00161a8a;
LAB_0015d535:
  if (CONCAT13(x._3_1_,CONCAT12(x._2_1_,CONCAT11(x._1_1_,x._0_1_))) <= lVar32) goto LAB_0015d874;
  iVar4 = __isoc99_fscanf(pFVar19,"%lf %lf %lf",key_pos,key_pos + 1,key_pos + 2);
  if (iVar4 != 3) {
    pcVar33 = "xyz";
    uStackY_ac0 = 0x7b;
    goto LAB_0015bc82;
  }
  pRVar17 = pRVar1->real;
  for (lVar24 = 0; lVar24 != 3; lVar24 = lVar24 + 1) {
    *(REF_FILEPOS *)((long)pRVar17 + lVar24 * 8 + lVar25) = key_pos[lVar24];
  }
  lVar32 = lVar32 + 1;
  lVar25 = lVar25 + 0x78;
  goto LAB_0015d535;
LAB_0015d874:
  pRVar2 = pRVar30->cell[3];
  nodes[3] = -1;
  iVar4 = 0;
  do {
    if ((int)y._0_4_ <= iVar4) {
      pRVar2 = pRVar30->cell[3];
      iVar4 = 0;
      goto LAB_0015e6c4;
    }
    lVar32 = 0;
    while (lVar32 + 4 != 0x10) {
      iVar10 = __isoc99_fscanf(pFVar19,"%d",(long)nodes + lVar32);
      lVar32 = lVar32 + 4;
      if (iVar10 != 1) {
        pcVar33 = "tri";
        uStackY_ac0 = 0x84;
        goto LAB_0015bc82;
      }
    }
    nodes[0] = nodes[0] + -1;
    nodes[1] = nodes[1] + -1;
    nodes[2] = nodes[2] + -1;
    uVar8 = ref_cell_add(pRVar2,nodes,&nnode);
    if (uVar8 != 0) {
      uVar20 = (ulong)uVar8;
      pcVar33 = "new tri";
      uStackY_ac0 = 0x88;
      goto LAB_0015b0e3;
    }
    bVar34 = iVar4 == nnode;
    iVar4 = iVar4 + 1;
  } while (bVar34);
  pcVar33 = "tri index";
  uStackY_ac0 = 0x89;
LAB_0015bc82:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
         uStackY_ac0,"ref_import_tri",pcVar33);
  uStackY_ac0 = 1;
LAB_0015bc8c:
  pcVar33 = "tri failed";
  uVar26 = 0x6c8;
  goto LAB_00161a8a;
LAB_0015e6c4:
  if ((int)y._0_4_ <= iVar4) goto LAB_00161a4e;
  iVar10 = __isoc99_fscanf(pFVar19,"%d",&ntri);
  if (iVar10 != 1) {
    pcVar33 = "tri id";
    uStackY_ac0 = 0x8e;
    goto LAB_0015bc82;
  }
  pRVar2->c2n[(long)iVar4 * (long)pRVar2->size_per + 3] = ntri;
  iVar4 = iVar4 + 1;
  goto LAB_0015e6c4;
  while( true ) {
    lVar32 = 0;
    while (lVar32 + 4 != 0x18) {
      iVar10 = __isoc99_fscanf(pFVar19,"%d",(long)nodes + lVar32);
      lVar32 = lVar32 + 4;
      if (iVar10 != 1) {
        pcVar33 = "qua";
        uVar26 = 0x1b8;
        goto LAB_0015d4f8;
      }
    }
    iVar10 = 3;
    while (iVar10 = iVar10 + -1, iVar10 != 0) {
      iVar9 = __isoc99_fscanf(pFVar19,"%d",&nid);
      if (iVar9 != 1) {
        pcVar33 = "extra 0 1";
        uVar26 = 0x1ba;
        goto LAB_0015d4f8;
      }
    }
    nodes[0] = nodes[0] + -1;
    nodes[1] = nodes[1] + -1;
    nodes[2] = nodes[2] + -1;
    nodes[3] = nodes[3] + -1;
    uVar8 = ref_cell_add(pRVar2,nodes,&new_cell);
    if (uVar8 != 0) {
      uStackY_ac0 = (ulong)uVar8;
      pcVar33 = "new qua";
      uVar26 = 0x1bf;
      goto LAB_0015b51f;
    }
    bVar34 = iVar4 != new_cell;
    iVar4 = iVar4 + 1;
    if (bVar34) break;
LAB_0015f4bb:
    if (nnode <= iVar4) goto LAB_00161a4e;
  }
  pcVar33 = "qua index";
  uVar26 = 0x1c0;
  goto LAB_0015d4f8;
code_r0x0015bbf9:
  if (uVar20 != (uint)nnode) goto code_r0x0015bc02;
  goto LAB_0015bbcf;
code_r0x0015bc02:
  pcVar33 = "node index";
  uVar26 = 0xb3;
LAB_0015d7a0:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar26,
         "ref_import_fgrid",pcVar33);
  uStackY_ac0 = 1;
LAB_0015d7aa:
  pcVar33 = "fgrid failed";
  uVar26 = 0x6cc;
  goto LAB_00161a8a;
LAB_0015e1d9:
  fclose(pFVar19);
  uStackY_ac0 = 6;
LAB_0015f316:
  pcVar33 = "msh failed";
  uVar26 = 0x6d0;
  goto LAB_00161a8a;
LAB_0015c960:
  iVar4 = bcmp("$Elements",key_pos,10);
  pRVar22 = local_9b0;
  pRVar21 = local_a48;
  if (iVar4 != 0) goto LAB_0015c7cb;
  iVar4 = __isoc99_fscanf(pFVar19,"%d %d %d %d",&nnode,&nelem,&filetype,&datasize);
  if (iVar4 == 4) {
    local_a28 = 0;
    printf("$Elements\n%d %d %d %d\n",(ulong)(uint)nnode,(ulong)(uint)nelem,(ulong)(uint)filetype,
           (ulong)(uint)datasize);
    for (; pRVar22 = local_9b0, pRVar21 = local_a48, local_a28 < nnode; local_a28 = local_a28 + 1) {
      iVar4 = __isoc99_fscanf(pFVar19,"%d %d %d %d",&entity_dim,&entity_tag,&type,&parameric);
      if (iVar4 != 4) {
        pcVar33 = "entityDim(int) entityTag(int) elementType(int) numElementsInBlock(size_t)";
        uVar20 = 4;
        uVar26 = 0x466;
        uVar18 = (long)iVar4;
        goto LAB_0015f30c;
      }
      printf("element bloc %d of %d\n",(ulong)(uint)parameric,(ulong)(uint)type);
      pRVar21 = local_9b0;
      switch(type) {
      case 1:
        break;
      case 2:
        pRVar21 = (REF_GRID_conflict)(pRVar30->cell + 3);
        break;
      case 3:
        pRVar21 = local_a68;
        break;
      case 4:
        pRVar21 = local_928;
        break;
      case 5:
        pRVar21 = local_920;
        break;
      case 6:
        pRVar21 = local_918;
        break;
      case 7:
        pRVar21 = local_9d0;
        break;
      case 8:
        pRVar21 = local_9c0;
        break;
      case 9:
        pRVar21 = local_9e0;
        break;
      default:
        printf("type = %d\n");
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x48f,"ref_import_msh","unknown $Elements type");
        goto LAB_0015f313;
      case 0xb:
        pRVar21 = local_9d8;
        break;
      case 0x15:
        pRVar21 = local_9f8;
        break;
      case 0x1a:
        pRVar21 = local_a38;
      }
      pRVar2 = (REF_CELL)pRVar21->mpi;
      local_9e8 = local_9e8 & 0xffffffff00000000;
      while ((int)local_9e8 < parameric) {
        iVar4 = __isoc99_fscanf(pFVar19,"%d",&n);
        if (iVar4 != 1) {
          uVar18 = (ulong)iVar4;
          pcVar33 = "elementTag(size_t)";
          uVar20 = 1;
          uVar26 = 0x493;
          goto LAB_0015f30c;
        }
        piVar31 = nodes;
        for (lVar32 = 0; lVar32 < pRVar2->node_per; lVar32 = lVar32 + 1) {
          iVar4 = __isoc99_fscanf(pFVar19,"%d",piVar31);
          if (iVar4 != 1) {
            uVar18 = (ulong)iVar4;
            pcVar33 = "nodeTag(size_t)";
            uVar20 = 1;
            uVar26 = 0x495;
            goto LAB_0015f30c;
          }
          *piVar31 = *piVar31 + -1;
          piVar31 = piVar31 + 1;
        }
        if (pRVar2->last_node_is_an_id != 0) {
          nodes[pRVar2->node_per] = n;
        }
        RVar35 = nodes[2];
        RVar36 = nodes[1];
        RVar7 = pRVar2->type;
        if (RVar7 == REF_CELL_PYR) {
          n1 = nodes[0];
          n2 = nodes[1];
          n3 = nodes[2];
          new_cell_1 = nodes[3];
          nodes[1] = nodes[3];
          nodes[2] = nodes[4];
          nodes[3] = RVar36;
          nodes[4] = RVar35;
          RVar7 = pRVar2->type;
        }
        if (RVar7 == REF_CELL_TE2) {
          RVar36 = SUB84(nodes._32_8_,4);
          nodes[9] = (REF_INT)nodes._32_8_;
          nodes[8] = RVar36;
        }
        uVar8 = ref_cell_add(pRVar2,nodes,&new_cell_3);
        if (uVar8 != 0) {
          uStackY_ac0 = (ulong)uVar8;
          pcVar33 = "add $Element";
          uVar26 = 0x4ab;
          goto LAB_0015bada;
        }
        local_9e8 = CONCAT44(local_9e8._4_4_,(int)local_9e8 + 1);
      }
    }
    goto LAB_0015c7cb;
  }
  pcVar33 = "n entity bloc, nnode, min/max tag";
  uVar20 = 4;
  uVar26 = 0x45e;
  uVar18 = (long)iVar4;
LAB_0015f30c:
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar26,
         "ref_import_msh",pcVar33,uVar20,uVar18);
LAB_0015f313:
  uStackY_ac0 = 1;
  goto LAB_0015f316;
  while( true ) {
    iVar10 = __isoc99_fscanf(pFVar19,"%d %d %d %d",&n0,&n1,&n2,&n3);
    if (iVar10 != 4) {
      lVar32 = (long)iVar10;
      pcVar33 = "read quad";
      uStackY_ac0 = 4;
      uVar26 = 0x537;
      goto LAB_0015e0d7;
    }
    nodes[0] = n0 + -1;
    nodes[1] = n1 + -1;
    nodes[2] = n2 + -1;
    nodes[3] = n3 + -1;
    nodes[4] = 1;
    uVar8 = ref_cell_add(local_a68->cell[6],nodes,&new_cell);
    if (uVar8 != 0) break;
LAB_0015ebaa:
    iVar4 = iVar4 + 1;
    if (nquad <= iVar4) {
      iVar4 = __isoc99_fscanf(pFVar19,"%d\n",&nid);
      if (iVar4 != 1) {
        lVar32 = (long)iVar4;
        pcVar33 = "number of edge groups";
        uStackY_ac0 = 1;
        uVar26 = 0x541;
        goto LAB_0015e0d7;
      }
      if ((long)nid < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x542,"ref_import_i_like_cfd_grid","malloc count of REF_INT negative");
        goto LAB_0015e0de;
      }
      __ptr = malloc((long)nid << 2);
      if (__ptr == (void *)0x0) {
        pcVar33 = "malloc count of REF_INT NULL";
        uVar26 = 0x542;
        goto LAB_0015d9e6;
      }
      lVar32 = 0;
      pvVar28 = __ptr;
      goto LAB_0015f410;
    }
  }
  pcVar33 = "quad face for qua";
  uVar26 = 0x53e;
LAB_0015e15a:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar26,
         "ref_import_i_like_cfd_grid",(ulong)uVar8,pcVar33);
  uStackY_ac0 = (ulong)uVar8;
  goto LAB_0015e167;
  while( true ) {
    iVar4 = __isoc99_fscanf(pFVar19,"%d\n",pvVar28);
    pvVar28 = (void *)((long)pvVar28 + 4);
    if (iVar4 != 1) break;
LAB_0015f410:
    uVar20 = (ulong)nid;
    lVar32 = lVar32 + 1;
    if ((long)uVar20 < lVar32) {
      lVar32 = 1;
      goto LAB_0015fb28;
    }
  }
  lVar32 = (long)iVar4;
  pcVar33 = "elements in edge groups";
  uStackY_ac0 = 1;
  uVar26 = 0x544;
LAB_0015e0d7:
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar26,
         "ref_import_i_like_cfd_grid",pcVar33,uStackY_ac0,lVar32);
LAB_0015e0de:
  uStackY_ac0 = 1;
LAB_0015e167:
  pcVar33 = "I Like CFD grid failed";
  uVar26 = 0x6d8;
  goto LAB_00161a8a;
LAB_0015fb28:
  if ((int)uVar20 < lVar32) goto LAB_001608a5;
  pcVar33 = fgets((char *)key_pos,0x400,pFVar19);
  if (pcVar33 == (char *)0x0) {
    pcVar33 = "read line for first edge node";
    uVar26 = 0x547;
    goto LAB_0015d9e6;
  }
  iVar4 = __isoc99_sscanf(key_pos,"%d",&n0);
  if (iVar4 != 1) {
    lVar32 = (long)iVar4;
    pcVar33 = "first edge node";
    uStackY_ac0 = 1;
    uVar26 = 0x548;
    goto LAB_0015e0d7;
  }
  for (iVar4 = 1; iVar4 < *(int *)((long)__ptr + lVar32 * 4 + -4); iVar4 = iVar4 + 1) {
    pcVar33 = fgets((char *)key_pos,0x400,pFVar19);
    if (pcVar33 == (char *)0x0) {
      pcVar33 = "read line for first edge node";
      uVar26 = 0x54a;
      goto LAB_0015d9e6;
    }
    iVar10 = __isoc99_sscanf(key_pos,"%d",&n1);
    if (iVar10 != 1) {
      lVar32 = (long)iVar10;
      pcVar33 = "next edge node";
      uStackY_ac0 = 1;
      uVar26 = 0x54b;
      goto LAB_0015e0d7;
    }
    nodes[0] = n0 + -1;
    nodes[1] = n1 + -1;
    nodes[2] = (REF_INT)lVar32;
    uVar8 = ref_cell_add(local_a68->cell[0],nodes,&new_cell);
    if (uVar8 != 0) {
      pcVar33 = "add edge to edg";
      uVar26 = 0x550;
      goto LAB_0015dfbc;
    }
    n0 = n1;
  }
  lVar32 = lVar32 + 1;
  uVar20 = (ulong)(uint)nid;
  goto LAB_0015fb28;
LAB_001608a5:
  free(__ptr);
  goto LAB_00161a4e;
LAB_0016041e:
  if (local_a68 == (REF_GRID_conflict)0x10) goto LAB_00160aca;
  local_a38 = (REF_GRID_conflict)pRVar30->cell[(long)local_a68];
  uVar8 = ref_cell_meshb_keyword((REF_CELL)local_a38,&nid);
  if (uVar8 != 0) {
    uStackY_ac0 = (ulong)uVar8;
    pcVar33 = "kw";
    uVar26 = 0x64a;
    goto LAB_0015d441;
  }
  uVar8 = ref_import_meshb_jump
                    ((FILE *)pFVar19,RVar36,key_pos,nid,&new_cell,(REF_FILEPOS *)&new_node);
  if (uVar8 != 0) {
    uStackY_ac0 = (ulong)uVar8;
    pcVar33 = "jump";
    uVar26 = 0x64d;
    goto LAB_0015d441;
  }
  if (new_cell != 0) {
    uVar8 = *(REF_INT *)((long)&local_a38->node + 4);
    RVar11 = ref_import_meshb_int((FILE *)pFVar19,RVar36,&n3);
    if (RVar11 != 0) {
      pcVar33 = "ncell";
      uStackY_ac0 = 1;
      uVar26 = 0x650;
      goto LAB_0015d441;
    }
    local_9f8 = (REF_GRID_conflict)((ulong)local_9f8 & 0xffffffff00000000);
    RVar35 = n3;
    if (n3 < 1) {
      RVar35 = 0;
    }
    local_9d8 = (REF_GRID_conflict)CONCAT44(local_9d8._4_4_,RVar35);
    pRVar21 = (REF_GRID_conflict)0x0;
    if (0 < (int)uVar8) {
      pRVar21 = (REF_GRID_conflict)(ulong)uVar8;
    }
    if ((int)uVar8 < 0) {
      uVar8 = 0xffffffff;
    }
    local_9e0 = (REF_GRID_conflict)((long)(int)uVar8 + 2);
    while( true ) {
      if ((int)local_9f8 == (int)local_9d8) break;
      value = nodes;
      pRVar22 = local_9e0;
      while (pRVar22 = (REF_GRID_conflict)((long)&pRVar22[-1].surf + 3),
            pRVar22 != (REF_GRID_conflict)0x0) {
        RVar11 = ref_import_meshb_int((FILE *)pFVar19,RVar36,value);
        value = value + 1;
        if (RVar11 != 0) {
          pcVar33 = "c2n";
          uStackY_ac0 = 1;
          uVar26 = 0x654;
          goto LAB_0015d441;
        }
      }
      for (pRVar22 = (REF_GRID_conflict)0x0; pRVar21 != pRVar22;
          pRVar22 = (REF_GRID_conflict)((long)&pRVar22->mpi + 1)) {
        nodes[(long)pRVar22] = nodes[(long)pRVar22] + -1;
      }
      if (*(int *)&local_a38->mpi == 9) {
        RVar35 = nodes[1];
        RVar37 = nodes[2];
        nodes[1] = nodes[3];
        nodes[2] = nodes[4];
        nodes[3] = RVar35;
        nodes[4] = RVar37;
      }
      uVar8 = ref_cell_add((REF_CELL)local_a38,nodes,&new_cell_1);
      uStackY_ac0 = (ulong)uVar8;
      local_9f8 = (REF_GRID_conflict)CONCAT44(local_9f8._4_4_,(int)local_9f8 + 1);
      local_a48 = pRVar21;
      if (uVar8 != 0) {
        pcVar33 = "add cell";
        uVar26 = 0x667;
        goto LAB_0015d441;
      }
    }
    sVar29 = CONCAT44(uStack_a4c,new_node);
    sVar13 = ftell(pFVar19);
    if (sVar29 != sVar13) {
      pcVar33 = "cell inconsistent";
      uVar26 = 0x669;
      goto LAB_0015e45c;
    }
  }
  local_a68 = (REF_GRID_conflict)((long)&local_a68->mpi + 1);
  goto LAB_0016041e;
LAB_00160aca:
  n1 = (REF_INT)local_a48;
  lVar32 = 8;
  for (local_a90 = 0; local_a90 != 3; local_a90 = local_a90 + 1) {
    uVar12 = (uint)local_a90;
    uVar8 = ref_import_meshb_jump
                      ((FILE *)pFVar19,RVar36,key_pos,uVar12 | 0x28,&new_cell,
                       (REF_FILEPOS *)&new_node);
    if (uVar8 != 0) {
      uStackY_ac0 = (ulong)uVar8;
      pcVar33 = "jump";
      uVar26 = 0x671;
      goto LAB_0015d441;
    }
    if (new_cell != 0) {
      RVar11 = ref_import_meshb_int((FILE *)pFVar19,RVar36,&ngeom);
      if (RVar11 != 0) {
        pcVar33 = "ngeom";
        uStackY_ac0 = 1;
        uVar26 = 0x673;
        goto LAB_0015d441;
      }
      local_a68 = (REF_GRID_conflict)((ulong)local_a68 & 0xffffffff00000000);
      RVar35 = ngeom;
      if (ngeom < 1) {
        RVar35 = 0;
      }
      local_a48 = (REF_GRID_conflict)CONCAT44(local_a48._4_4_,RVar35);
      while( true ) {
        if ((int)local_a68 == (int)local_a48) break;
        RVar11 = ref_import_meshb_int((FILE *)pFVar19,RVar36,&n1);
        if (RVar11 != 0) {
          pcVar33 = "node";
          uStackY_ac0 = 1;
          uVar26 = 0x677;
          goto LAB_0015d441;
        }
        RVar11 = ref_import_meshb_int((FILE *)pFVar19,RVar36,&id);
        if (RVar11 != 0) {
          pcVar33 = "node";
          uStackY_ac0 = 1;
          uVar26 = 0x678;
          goto LAB_0015d441;
        }
        lVar25 = 0;
        while (lVar32 != lVar25 + 8) {
          sVar13 = fread((void *)((long)&x + lVar25),8,1,pFVar19);
          lVar25 = lVar25 + 8;
          if (sVar13 != 1) {
            pcVar33 = "param";
            sVar29 = 1;
            uVar26 = 0x67a;
            goto LAB_0015e45c;
          }
        }
        iVar4 = n1 + -1;
        local_a38 = (REF_GRID_conflict)CONCAT44(local_a38._4_4_,id);
        n1 = iVar4;
        uVar8 = ref_geom_add(ref_geom,iVar4,uVar12,id,&x);
        if (uVar8 != 0) {
          uStackY_ac0 = (ulong)uVar8;
          pcVar33 = "add geom";
          uVar26 = 0x67c;
          goto LAB_0015d441;
        }
        if (local_a90 != 0) {
          sVar13 = fread(&y,8,1,pFVar19);
          if (sVar13 != 1) {
            pcVar33 = "gref";
            sVar29 = 1;
            uVar26 = 0x680;
            goto LAB_0015e45c;
          }
          uVar8 = ref_geom_find(ref_geom,iVar4,uVar12,(int)local_a38,&nnode);
          if (uVar8 != 0) {
            uStackY_ac0 = (ulong)uVar8;
            pcVar33 = "find";
            uVar26 = 0x681;
            goto LAB_0015d441;
          }
          ref_geom->descr[(long)nnode * 6 + 2] = (int)(double)CONCAT44(y._4_4_,y._0_4_);
        }
        local_a68 = (REF_GRID_conflict)CONCAT44(local_a68._4_4_,(int)local_a68 + 1);
      }
      sVar29 = CONCAT44(uStack_a4c,new_node);
      sVar13 = ftello(pFVar19);
      if (sVar29 != sVar13) {
        pcVar33 = "end location";
        uVar26 = 0x685;
        goto LAB_0015e45c;
      }
    }
    lVar32 = lVar32 + 8;
  }
  uVar8 = ref_import_meshb_jump
                    ((FILE *)pFVar19,RVar36,key_pos,0x7e,&new_cell,(REF_FILEPOS *)&new_node);
  if (uVar8 != 0) {
    uStackY_ac0 = (ulong)uVar8;
    pcVar33 = "jump";
    uVar26 = 0x68c;
    goto LAB_0015d441;
  }
  if (new_cell != 0) {
    if (RVar36 < 4) {
      sVar13 = fread(&nnode,4,1,pFVar19);
      if (sVar13 != 1) {
        pcVar33 = "int value";
        uVar26 = 0x5e2;
LAB_001616b6:
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               uVar26,"ref_import_meshb_size",pcVar33,1,sVar13);
        pcVar33 = "cad data size";
        uStackY_ac0 = 1;
        uVar26 = 0x690;
        goto LAB_0015d441;
      }
      RVar23 = (REF_SIZE)(uint)nnode;
    }
    else {
      sVar13 = fread(&y,8,1,pFVar19);
      if (sVar13 != 1) {
        pcVar33 = "long value";
        uVar26 = 0x5e5;
        goto LAB_001616b6;
      }
      RVar23 = CONCAT44(y._4_4_,y._0_4_);
    }
    ref_geom->cad_data_size = RVar23;
    free(ref_geom->cad_data);
    sVar29 = ref_geom->cad_data_size;
    __ptr_00 = (REF_BYTE *)malloc(sVar29);
    ref_geom->cad_data = __ptr_00;
    if (__ptr_00 == (REF_BYTE *)0x0) {
      pcVar33 = "malloc ref_geom_cad_data(ref_geom) of REF_BYTE NULL";
      uVar26 = 0x696;
LAB_0015dc57:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             uVar26,"ref_import_meshb",pcVar33);
      uStackY_ac0 = 2;
    }
    else {
      sVar13 = fread(__ptr_00,1,sVar29,pFVar19);
      if (sVar29 == sVar13) {
        sVar29 = CONCAT44(uStack_a4c,new_node);
        sVar13 = ftello(pFVar19);
        if (sVar29 == sVar13) goto LAB_00161a4e;
        pcVar33 = "end location";
        uVar26 = 0x69b;
      }
      else {
        pcVar33 = "cad_data";
        uVar26 = 0x69a;
      }
LAB_0015e45c:
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             uVar26,"ref_import_meshb",pcVar33,sVar29,sVar13);
LAB_0015e463:
      uStackY_ac0 = 1;
    }
LAB_0015d44b:
    pcVar33 = "meshb failed";
    uVar26 = 0x6d5;
    goto LAB_00161a8a;
  }
LAB_00161a4e:
  fclose(pFVar19);
  ref_grid_ptr = local_a30;
LAB_00161a5b:
  uVar8 = ref_grid_inward_boundary_orientation(*ref_grid_ptr);
  if (uVar8 == 0) {
    return 0;
  }
  uStackY_ac0 = (ulong)uVar8;
  pcVar33 = "inward boundary orientation";
  uVar26 = 0x6e2;
  goto LAB_00161a8a;
LAB_0015fcec:
  fclose(pFVar19);
  uVar8 = ref_node_initialize_n_global(pRVar1,(long)new_node);
  if (uVar8 == 0) {
    snprintf((char *)key_pos,0x3fb,"%s.face");
    pFVar19 = fopen((char *)key_pos,"r");
    if (pFVar19 != (FILE *)0x0) {
      iVar4 = __isoc99_fscanf(pFVar19,"%d",&n0);
      if (iVar4 == 1) {
        iVar4 = __isoc99_fscanf(pFVar19,"%d",&nquad);
        if (iVar4 == 1) {
          pRVar2 = pRVar30->cell[3];
          for (uVar8 = 0; (int)uVar8 < n0; uVar8 = uVar8 + 1) {
            iVar4 = __isoc99_fscanf(pFVar19,"%d",&new_cell);
            if (iVar4 != 1) {
              lVar32 = (long)iVar4;
              pcVar33 = "read tri item";
              uStackY_ac0 = 1;
              uVar26 = 0x4f4;
              goto LAB_0015bd0b;
            }
            lVar32 = (long)new_cell;
            if (uVar8 != new_cell) {
              uStackY_ac0 = (ulong)uVar8;
              pcVar33 = "tri index";
              uVar26 = 0x4f5;
              goto LAB_0015bd0b;
            }
            lVar32 = 0;
            while (lVar32 + 4 != 0x10) {
              iVar4 = __isoc99_fscanf(pFVar19,"%d",(long)&x + lVar32);
              lVar32 = lVar32 + 4;
              if (iVar4 != 1) {
                pcVar33 = "tri";
                uVar26 = 0x4f7;
                goto LAB_0015fff3;
              }
            }
            n2 = 0;
            if ((nquad == 1) && (iVar4 = __isoc99_fscanf(pFVar19,"%d",&n2), iVar4 != 1)) {
              lVar32 = (long)iVar4;
              pcVar33 = "tri mark id";
              uStackY_ac0 = 1;
              uVar26 = 0x4f9;
              goto LAB_0015bd0b;
            }
            RStack_98c = n2;
            printf("cell %d: %d %d %d %d\n",(ulong)uVar8,
                   (ulong)CONCAT13(x._3_1_,CONCAT12(x._2_1_,CONCAT11(x._1_1_,x._0_1_))),
                   (ulong)x._4_4_,(ulong)local_990);
            uVar12 = ref_cell_add(pRVar2,(REF_INT *)&x,&n1);
            if (uVar12 != 0) {
              uStackY_ac0 = (ulong)uVar12;
              pcVar33 = "tri face for tri";
              uVar26 = 0x4fd;
              goto LAB_0015d314;
            }
          }
          goto LAB_00161a4e;
        }
        lVar32 = (long)iVar4;
        pcVar33 = "face header mark";
        uStackY_ac0 = 1;
        uVar26 = 0x4f0;
      }
      else {
        lVar32 = (long)iVar4;
        pcVar33 = "face header ntri";
        uStackY_ac0 = 1;
        uVar26 = 0x4ef;
      }
      goto LAB_0015bd0b;
    }
    printf("unable to open %s\n",key_pos);
    uVar26 = 0x4ee;
LAB_0015da24:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar26
           ,"ref_import_tetgen_node","unable to open file");
    uStackY_ac0 = 2;
  }
  else {
    uStackY_ac0 = (ulong)uVar8;
    pcVar33 = "init glob";
    uVar26 = 0x4e9;
LAB_0015d314:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar26
           ,"ref_import_tetgen_node",uStackY_ac0,pcVar33);
  }
LAB_0015d31e:
  pcVar33 = "tetgen node failed";
  uVar26 = 0x6d3;
  goto LAB_00161a8a;
  while (bVar34 = iVar4 == n1, iVar4 = iVar4 + 1, bVar34) {
LAB_0015f9c3:
    if (new_node <= iVar4) {
      pRVar2 = pRVar30->cell[3];
      iVar4 = 0;
      goto LAB_00160638;
    }
    lVar32 = 0;
    while (lVar32 + 4 != 0x14) {
      iVar10 = __isoc99_fscanf(pFVar19,"%d",(long)key_pos + lVar32);
      lVar32 = lVar32 + 4;
      if (iVar10 != 1) {
        pcVar33 = "qua";
        uVar26 = 0x122;
        goto LAB_0015dcf8;
      }
    }
    key_pos[1]._0_4_ = (int)key_pos[1] + -1;
    key_pos[1]._4_4_ = key_pos[1]._4_4_ + -1;
    key_pos[0] = CONCAT44(key_pos[0]._4_4_ + -1,(int)key_pos[0] + -1);
    uVar8 = ref_cell_add(pRVar2,(REF_INT *)key_pos,&n1);
    if (uVar8 != 0) {
      uStackY_ac0 = (ulong)uVar8;
      pcVar33 = "new qua";
      uVar26 = 0x127;
      goto LAB_0015b09e;
    }
  }
  pcVar33 = "qua index";
  uVar26 = 0x128;
  goto LAB_0015dcf8;
LAB_00160638:
  if ((int)y._0_4_ <= iVar4) goto LAB_001606d1;
  iVar10 = __isoc99_fscanf(pFVar19,"%d",&n2);
  if (iVar10 != 1) {
    pcVar33 = "tri id";
    uVar26 = 0x12d;
    goto LAB_0015dcf8;
  }
  pRVar2->c2n[(long)iVar4 * (long)pRVar2->size_per + 3] = n2;
  iVar4 = iVar4 + 1;
  goto LAB_00160638;
LAB_001606d1:
  pRVar2 = pRVar30->cell[6];
  for (iVar4 = 0; iVar4 < new_node; iVar4 = iVar4 + 1) {
    iVar10 = __isoc99_fscanf(pFVar19,"%d",&n2);
    if (iVar10 != 1) {
      pcVar33 = "qua id";
      uVar26 = 0x133;
      goto LAB_0015dcf8;
    }
    pRVar2->c2n[(long)iVar4 * (long)pRVar2->size_per + 4] = n2;
  }
  if (0 < ref_mpi->timing) {
    ref_mpi_stopwatch_stop(ref_mpi,"ugrid tri");
  }
  pRVar2 = pRVar30->cell[8];
  iVar4 = 0;
  do {
    if (nnode <= iVar4) {
      if (0 < ref_mpi->timing) {
        ref_mpi_stopwatch_stop(ref_mpi,"ugrid tet");
      }
      pRVar2 = pRVar30->cell[9];
      iVar4 = 0;
      goto LAB_00160e41;
    }
    lVar32 = 0;
    while (lVar32 + 4 != 0x14) {
      iVar10 = __isoc99_fscanf(pFVar19,"%d",(long)key_pos + lVar32);
      lVar32 = lVar32 + 4;
      if (iVar10 != 1) {
        pcVar33 = "tet";
        uVar26 = 0x13b;
        goto LAB_0015dcf8;
      }
    }
    key_pos[1]._0_4_ = (int)key_pos[1] + -1;
    key_pos[1]._4_4_ = key_pos[1]._4_4_ + -1;
    key_pos[0] = CONCAT44(key_pos[0]._4_4_ + -1,(int)key_pos[0] + -1);
    uVar8 = ref_cell_add(pRVar2,(REF_INT *)key_pos,&n3);
    if (uVar8 != 0) {
      uStackY_ac0 = (ulong)uVar8;
      pcVar33 = "new tet";
      uVar26 = 0x140;
      goto LAB_0015b09e;
    }
    bVar34 = iVar4 == n3;
    iVar4 = iVar4 + 1;
  } while (bVar34);
  pcVar33 = "tet index";
  uVar26 = 0x141;
  goto LAB_0015dcf8;
  while( true ) {
    lVar32 = 0;
    while (lVar32 + 4 != 0x18) {
      iVar10 = __isoc99_fscanf(pFVar19,"%d",(long)key_pos + lVar32);
      lVar32 = lVar32 + 4;
      if (iVar10 != 1) {
        pcVar33 = "pyr";
        uVar26 = 0x148;
        goto LAB_0015dcf8;
      }
    }
    key_pos[1]._0_4_ = (int)key_pos[1] + -1;
    key_pos[1]._4_4_ = key_pos[1]._4_4_ + -1;
    key_pos[0] = CONCAT44(key_pos[0]._4_4_ + -1,(int)key_pos[0] + -1);
    key_pos[2] = CONCAT44(key_pos[2]._4_4_,(int)key_pos[2] + -1);
    uVar8 = ref_cell_add(pRVar2,(REF_INT *)key_pos,&n3);
    if (uVar8 != 0) {
      uStackY_ac0 = (ulong)uVar8;
      pcVar33 = "new pyr";
      uVar26 = 0x14e;
      goto LAB_0015b09e;
    }
    bVar34 = iVar4 != n3;
    iVar4 = iVar4 + 1;
    if (bVar34) break;
LAB_00160e41:
    if (ntri <= iVar4) {
      if (0 < ref_mpi->timing) {
        ref_mpi_stopwatch_stop(ref_mpi,"ugrid pyr");
      }
      pRVar2 = pRVar30->cell[10];
      uVar8 = 0;
      goto LAB_00161386;
    }
  }
  pcVar33 = "pyr index";
  uVar26 = 0x14f;
  goto LAB_0015dcf8;
  while( true ) {
    lVar32 = 0;
    while (lVar32 + 4 != 0x1c) {
      iVar4 = __isoc99_fscanf(pFVar19,"%d",(long)key_pos + lVar32);
      lVar32 = lVar32 + 4;
      if (iVar4 != 1) {
        pcVar33 = "pri";
        uVar26 = 0x156;
        goto LAB_0015dcf8;
      }
    }
    key_pos[1]._0_4_ = (int)key_pos[1] + -1;
    key_pos[1]._4_4_ = key_pos[1]._4_4_ + -1;
    key_pos[0] = CONCAT44(key_pos[0]._4_4_ + -1,(int)key_pos[0] + -1);
    key_pos[2] = CONCAT44((int)((ulong)key_pos[2] >> 0x20) + -1,(int)key_pos[2] + -1);
    uVar12 = ref_cell_add(pRVar2,(REF_INT *)key_pos,&n3);
    if (uVar12 != 0) {
      uStackY_ac0 = (ulong)uVar12;
      pcVar33 = "new pri";
      uVar26 = 0x15d;
      goto LAB_0015b09e;
    }
    uVar12 = uVar8;
    if (uVar8 != n3) {
      printf("cell %d %d\n",(ulong)uVar8);
      uVar12 = n3;
    }
    bVar34 = uVar8 != uVar12;
    uVar8 = uVar8 + 1;
    if (bVar34) break;
LAB_00161386:
    if (nquad <= (int)uVar8) {
      if (0 < ref_mpi->timing) {
        ref_mpi_stopwatch_stop(ref_mpi,"ugrid pri");
      }
      pRVar2 = pRVar30->cell[0xb];
      iVar4 = 0;
      goto LAB_001617de;
    }
  }
  pcVar33 = "pri index";
  uVar26 = 0x163;
  goto LAB_0015dcf8;
  while (bVar34 = iVar4 == n3, iVar4 = iVar4 + 1, bVar34) {
LAB_001617de:
    if (new_cell <= iVar4) {
      if (0 < ref_mpi->timing) {
        ref_mpi_stopwatch_stop(ref_mpi,"ugrid hex");
      }
      goto LAB_00161a4e;
    }
    lVar32 = 0;
    while (lVar32 + 4 != 0x24) {
      iVar10 = __isoc99_fscanf(pFVar19,"%d",(long)key_pos + lVar32);
      lVar32 = lVar32 + 4;
      if (iVar10 != 1) {
        pcVar33 = "hex";
        uVar26 = 0x16a;
        goto LAB_0015dcf8;
      }
    }
    key_pos[1]._0_4_ = (int)key_pos[1] + -1;
    key_pos[1]._4_4_ = key_pos[1]._4_4_ + -1;
    key_pos[0] = CONCAT44(key_pos[0]._4_4_ + -1,(int)key_pos[0] + -1);
    key_pos[3]._0_4_ = (int)key_pos[3] + -1;
    key_pos[3]._4_4_ = key_pos[3]._4_4_ + -1;
    key_pos[2] = CONCAT44(key_pos[2]._4_4_ + -1,(int)key_pos[2] + -1);
    uVar8 = ref_cell_add(pRVar2,(REF_INT *)key_pos,&n3);
    if (uVar8 != 0) {
      uStackY_ac0 = (ulong)uVar8;
      pcVar33 = "new hex";
      uVar26 = 0x173;
      goto LAB_0015b09e;
    }
  }
  pcVar33 = "hex index";
  uVar26 = 0x174;
LAB_0015dcf8:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar26,
         "ref_import_ugrid",pcVar33);
  uStackY_ac0 = 1;
LAB_0015dd02:
  pcVar33 = "ugrid failed";
  uVar26 = 0x6c6;
LAB_00161a8a:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar26,
         "ref_import_by_extension",uStackY_ac0,pcVar33);
  return (REF_STATUS)uStackY_ac0;
}

Assistant:

REF_FCN REF_STATUS ref_import_by_extension(REF_GRID *ref_grid_ptr,
                                           REF_MPI ref_mpi,
                                           const char *filename) {
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (strcmp(&filename[end_of_string - 10], ".lb8.ugrid") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                             REF_FALSE),
        "lb8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 9], ".b8.ugrid") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE,
                             REF_FALSE),
        "b8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 11], ".lb8l.ugrid") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                             REF_TRUE),
        "lb8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 10], ".b8l.ugrid") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE,
                             REF_TRUE),
        "b8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 12], ".lb8.ugrid64") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                             REF_TRUE),
        "lb8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 11], ".b8.ugrid64") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE,
                             REF_TRUE),
        "b8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 9], ".r8.ugrid") == 0) {
    RSS(ref_import_r8_ugrid(ref_grid_ptr, ref_mpi, filename),
        "r8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 6], ".ugrid") == 0) {
    RSS(ref_import_ugrid(ref_grid_ptr, ref_mpi, filename), "ugrid failed");
  } else if (strcmp(&filename[end_of_string - 4], ".tri") == 0) {
    RSS(ref_import_tri(ref_grid_ptr, ref_mpi, filename), "tri failed");
  } else if (strcmp(&filename[end_of_string - 5], ".surf") == 0) {
    RSS(ref_import_surf(ref_grid_ptr, ref_mpi, filename), "surf failed");
  } else if (strcmp(&filename[end_of_string - 6], ".fgrid") == 0) {
    RSS(ref_import_fgrid(ref_grid_ptr, ref_mpi, filename), "fgrid failed");
  } else if (strcmp(&filename[end_of_string - 4], ".su2") == 0) {
    RSS(ref_import_su2(ref_grid_ptr, ref_mpi, filename), "su2 failed");
  } else if (strcmp(&filename[end_of_string - 4], ".msh") == 0) {
    RSS(ref_import_msh(ref_grid_ptr, ref_mpi, filename), "msh failed");
  } else if (strcmp(&filename[end_of_string - 5], ".node") == 0) {
    RSS(ref_import_tetgen_node(ref_grid_ptr, ref_mpi, filename),
        "tetgen node failed");
  } else if (strcmp(&filename[end_of_string - 6], ".meshb") == 0) {
    RSS(ref_import_meshb(ref_grid_ptr, ref_mpi, filename), "meshb failed");
  } else if (strcmp(&filename[end_of_string - 5], ".grid") == 0) {
    RSS(ref_import_i_like_cfd_grid(ref_grid_ptr, ref_mpi, filename),
        "I Like CFD grid failed");
  } else if (strcmp(&filename[end_of_string - 4], ".avm") == 0) {
    RSS(ref_part_by_extension(ref_grid_ptr, ref_mpi, filename), "part failed");
  } else {
    printf("%s: %d: %s %s\n", __FILE__, __LINE__,
           "input file name extension unknown", filename);
    RSS(REF_FAILURE, "unknown file extension");
  }

  RSS(ref_grid_inward_boundary_orientation(*ref_grid_ptr),
      "inward boundary orientation");

  return REF_SUCCESS;
}